

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O3

void target_machinize(gen_ctx_t gen_ctx)

{
  undefined1 *puVar1;
  VARR_size_t **ppVVar2;
  VARR_size_t **ppVVar3;
  char cVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  ushort uVar8;
  MIR_context_t ctx;
  VARR_MIR_var_t *pVVar9;
  MIR_var_t *pMVar10;
  ulong *puVar11;
  int iVar12;
  MIR_module_t_conflict pMVar13;
  void *pvVar14;
  MIR_module_t_conflict pMVar15;
  VARR_size_t *pVVar16;
  MIR_insn_t pMVar17;
  void *pvVar18;
  undefined8 uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 *puVar22;
  undefined7 uVar23;
  undefined1 uVar24;
  MIR_item_t_conflict pMVar25;
  int iVar26;
  MIR_reg_t MVar27;
  MIR_reg_t MVar28;
  uint uVar29;
  MIR_insn_t_conflict pMVar30;
  size_t sVar31;
  MIR_func_t pMVar32;
  MIR_insn_t pMVar33;
  MIR_item_t_conflict pMVar34;
  MIR_item_t_conflict pMVar35;
  MIR_insn_t_conflict pMVar36;
  MIR_context_t pMVar37;
  target_ctx *ptVar38;
  MIR_error_func_t p_Var39;
  int iVar40;
  uint uVar41;
  MIR_insn_t pMVar42;
  undefined1 *puVar43;
  MIR_reg_t base;
  MIR_type_t MVar44;
  MIR_insn_code_t MVar45;
  int64_t i;
  MIR_context_t before;
  MIR_type_t MVar46;
  ulong uVar47;
  char *pcVar48;
  int iVar49;
  MIR_error_type_t MVar50;
  ulong uVar51;
  ulong uVar52;
  byte bVar53;
  uint uVar54;
  MIR_context_t unaff_R14;
  MIR_module *pMVar55;
  int64_t i_00;
  int iVar56;
  long lVar57;
  ulong uVar58;
  uint32_t *puVar59;
  bool bVar60;
  MIR_module_t_conflict pMVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  MIR_insn_code_t new_insn_code;
  MIR_op_t temp_op;
  MIR_insn_code_t mov_code2;
  size_t fp_arg_num_1;
  size_t int_arg_num_1;
  MIR_insn_code_t new_insn_code_1;
  size_t fp_arg_num;
  size_t int_arg_num;
  MIR_op_t temp_op_1;
  MIR_op_t mem_op_1;
  MIR_op_t reg_op3;
  MIR_insn_code_t mov_code1;
  MIR_item_t func_import_item_1;
  MIR_op_t dest_reg_op;
  MIR_item_t proto_item_1;
  MIR_insn_code_t mov_code2_2;
  MIR_op_t ret_reg_op;
  MIR_item_t func_import_item;
  MIR_item_t proto_item;
  MIR_op_t mem_op;
  MIR_op_t arg_reg_op;
  MIR_item_t_conflict in_stack_fffffffffffff0f8;
  undefined4 uVar64;
  undefined8 in_stack_fffffffffffff108;
  undefined4 uVar65;
  undefined8 in_stack_fffffffffffff118;
  undefined4 uVar66;
  char local_e78;
  MIR_context_t local_e70;
  bool local_e61;
  long local_e60;
  ulong local_e50;
  MIR_insn_code_t local_e2c;
  MIR_context_t local_e28;
  char *local_e20;
  MIR_func_t local_e18;
  MIR_context_t local_e10;
  void *pvStack_e08;
  MIR_module_t_conflict pMStack_e00;
  MIR_func_t local_df8;
  MIR_item_t_conflict pMStack_df0;
  MIR_module_t pMStack_de8;
  MIR_module_t pMStack_de0;
  MIR_item_t_conflict local_dd8;
  MIR_module_t_conflict pMStack_dd0;
  byte bStack_dc8;
  undefined7 uStack_dc7;
  MIR_item_t_conflict pMStack_dc0;
  MIR_reg_t local_db8;
  undefined4 uStack_db4;
  HTAB_MIR_item_t *local_db0;
  ulong local_da0;
  ulong local_d98;
  size_t local_d90;
  size_t local_d88;
  MIR_insn_code_t local_d7c;
  size_t local_d78;
  size_t local_d70;
  MIR_item_t_conflict local_d68;
  MIR_module_t_conflict pMStack_d60;
  MIR_func_t pMStack_d58;
  undefined6 uStack_d50;
  undefined2 uStack_d4a;
  undefined6 uStack_d48;
  undefined2 uStack_d42;
  HTAB_MIR_item_t *pHStack_d40;
  ulong local_d30;
  size_t local_d28;
  MIR_func_t local_d20;
  MIR_item_t_conflict pMStack_d18;
  MIR_module_t_conflict pMStack_d10;
  MIR_func_t local_d08;
  undefined6 uStack_d00;
  undefined2 uStack_cfa;
  undefined6 uStack_cf8;
  undefined2 uStack_cf2;
  HTAB_MIR_item_t *pHStack_cf0;
  MIR_item_t_conflict local_ce8;
  undefined8 uStack_ce0;
  byte bStack_cd8;
  undefined7 uStack_cd7;
  undefined1 uStack_cd0;
  undefined7 uStack_ccf;
  undefined1 uStack_cc8;
  undefined7 uStack_cc7;
  HTAB_MIR_item_t *pHStack_cc0;
  undefined1 local_cb8 [16];
  anon_union_32_12_57d33f68_for_u aStack_ca8;
  MIR_item_t_conflict local_c88;
  MIR_module_t_conflict pMStack_c80;
  MIR_func_t pMStack_c78;
  MIR_item_t_conflict pMStack_c70;
  undefined1 auStack_c68 [16];
  MIR_item_t_conflict local_c58;
  undefined2 local_c50;
  undefined6 uStack_c4e;
  undefined2 local_c48;
  undefined6 uStack_c46;
  undefined2 uStack_c40;
  undefined6 uStack_c3e;
  undefined2 uStack_c38;
  undefined6 uStack_c36;
  undefined2 uStack_c30;
  undefined6 uStack_c2e;
  MIR_item_t_conflict local_c28;
  undefined1 local_c20 [8];
  MIR_func_t local_c18;
  MIR_item_t_conflict pMStack_c10;
  MIR_module_t pMStack_c08;
  HTAB_MIR_item_t *pHStack_c00;
  MIR_item_t_conflict local_bf8;
  undefined8 local_bf0;
  byte local_be8;
  undefined7 uStack_be7;
  undefined1 uStack_be0;
  undefined7 uStack_bdf;
  undefined1 uStack_bd8;
  undefined7 uStack_bd7;
  HTAB_MIR_item_t *pHStack_bd0;
  VARR_MIR_module_t *pVStack_bc8;
  VARR_MIR_op_t *pVStack_bc0;
  string_ctx *local_bb8;
  reg_ctx *prStack_bb0;
  alias_ctx *paStack_ba8;
  simplify_ctx *psStack_ba0;
  ulong local_b98;
  undefined8 *local_b90;
  undefined1 local_b88 [16];
  anon_union_32_12_57d33f68_for_u aStack_b78;
  VARR_size_t **local_b58;
  ulong local_b50;
  MIR_op_t local_b48;
  MIR_item_t_conflict local_b18;
  MIR_module_t_conflict pMStack_b10;
  MIR_func_t pMStack_b08;
  MIR_item_t_conflict pMStack_b00;
  MIR_module_t pMStack_af8;
  HTAB_MIR_item_t *pHStack_af0;
  undefined4 local_ae8;
  undefined2 uStack_ae4;
  MIR_item_t_conflict local_ab8;
  undefined8 uStack_ab0;
  MIR_func_t pMStack_aa8;
  undefined6 uStack_aa0;
  undefined2 uStack_a9a;
  undefined6 uStack_a98;
  undefined2 uStack_a92;
  MIR_insn_code_t local_a88;
  undefined4 uStack_a84;
  MIR_module_t_conflict pMStack_a80;
  MIR_func_t pMStack_a78;
  undefined8 uStack_a70;
  MIR_module_t pMStack_a68;
  undefined8 uStack_a60;
  MIR_item_t_conflict pMStack_a58;
  MIR_module_t_conflict pMStack_a50;
  MIR_func_t local_a48;
  MIR_item_t_conflict pMStack_a40;
  MIR_module_t pMStack_a38;
  HTAB_MIR_item_t *pHStack_a30;
  MIR_op_t local_a28;
  MIR_item_t_conflict local_9f8 [2];
  MIR_func_t pMStack_9e8;
  MIR_module_t pMStack_9d8;
  MIR_item_t_conflict pMStack_9c8;
  MIR_module_t_conflict pMStack_9c0;
  MIR_func_t local_9b8;
  MIR_item_t_conflict pMStack_9b0;
  MIR_module_t pMStack_9a8;
  HTAB_MIR_item_t *pHStack_9a0;
  MIR_item_t_conflict pMStack_998;
  MIR_module_t_conflict pMStack_990;
  MIR_func_t local_988;
  MIR_item_t_conflict pMStack_980;
  MIR_module_t pMStack_978;
  HTAB_MIR_item_t *pHStack_970;
  MIR_op_t local_908 [3];
  MIR_op_t local_878 [4];
  MIR_op_t local_7b8 [2];
  MIR_op_t local_758 [2];
  MIR_item_t_conflict local_6f8;
  MIR_func_t pMStack_6e8;
  MIR_module_t pMStack_6d8;
  MIR_item_t_conflict local_6c8;
  MIR_func_t pMStack_6b8;
  MIR_module_t pMStack_6a8;
  MIR_item_t_conflict local_638;
  MIR_func_t pMStack_628;
  MIR_module_t pMStack_618;
  MIR_item_t_conflict local_5d8;
  MIR_func_t pMStack_5c8;
  MIR_module_t pMStack_5b8;
  MIR_op_t local_578 [2];
  MIR_op_t local_518 [2];
  MIR_item_t_conflict local_4b8;
  MIR_func_t pMStack_4a8;
  MIR_module_t pMStack_498;
  MIR_op_t local_458 [2];
  MIR_op_t local_3f8 [3];
  MIR_item_t_conflict local_368;
  MIR_func_t pMStack_358;
  MIR_module_t pMStack_348;
  undefined8 local_1e8;
  undefined4 uStack_1e4;
  MIR_func_t pMStack_1d8;
  MIR_module_t pMStack_1c8;
  MIR_op_t local_c8;
  MIR_item_t_conflict local_98;
  MIR_func_t pMStack_88;
  MIR_module_t pMStack_78;
  MIR_op_t local_68;
  
  ctx = gen_ctx->ctx;
  local_d70 = 0;
  local_d78 = 0;
  if (gen_ctx->curr_func_item->item_type != MIR_func_item) {
    __assert_fail("curr_func_item->item_type == MIR_func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x2ba,"void target_machinize(gen_ctx_t)");
  }
  local_e18 = (gen_ctx->curr_func_item->u).func;
  ptVar38 = gen_ctx->target_ctx;
  ptVar38->block_arg_func_p = '\0';
  ptVar38->start_sp_from_bp_offset = 8;
  ptVar38->keep_fp_p = local_e18->vararg_p;
  if (local_e18->nargs != 0) {
    lVar57 = 0x10;
    uVar47 = 0;
    local_e70 = (MIR_context_t)0x0;
    do {
      pVVar9 = local_e18->vars;
      if (((pVVar9 == (VARR_MIR_var_t *)0x0) ||
          (pMVar10 = pVVar9->varr, pMVar10 == (MIR_var_t *)0x0)) || (pVVar9->els_num <= uVar47)) {
        target_machinize_cold_1();
LAB_0015ac33:
        __assert_fail("ret_reg_op.mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x1d8,"void machinize_call(gen_ctx_t, MIR_insn_t)");
      }
      MVar46 = *(MIR_type_t *)((long)pMVar10 + lVar57 + -0x10);
      if (MVar46 - MIR_T_RBLK < 0xfffffffb) {
        uVar58 = 0;
      }
      else {
        uVar58 = *(long *)((long)&pMVar10->type + lVar57) + 7U & 0xfffffffffffffff8;
      }
      iVar56 = (int)uVar47;
      if (MVar46 == (MIR_T_BLK|MIR_T_I16)) {
        if ((int)local_d78 == -0x11 || 7 < local_d78) goto LAB_0015703b;
        MVar46 = MIR_T_D;
        if (uVar58 < 9) {
LAB_00156ebf:
          MVar27 = get_arg_reg(MVar46,&local_d70,&local_d78,(MIR_insn_code_t *)local_cb8);
          MVar45 = local_cb8._0_4_;
        }
        else {
          if (6 < local_d78) goto LAB_0015703b;
LAB_0015715b:
          MVar27 = get_arg_reg(MVar46,&local_d70,&local_d78,(MIR_insn_code_t *)local_cb8);
          if (0x10 < uVar58) {
            __assert_fail("blk_size <= 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x2ce,"void target_machinize(gen_ctx_t)");
          }
          MVar28 = get_arg_reg(MVar46,&local_d70,&local_d78,(MIR_insn_code_t *)&local_dd8);
          MVar45 = local_cb8._0_4_;
          _MIR_new_var_mem_op(local_3f8,ctx,MVar46,8,iVar56 + 0x22,0xffffffff,'\x01');
          _MIR_new_var_op(ctx,MVar28);
          pMVar30 = MIR_new_insn(ctx,MVar45);
          MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar30);
          create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar30->insn_link).next,(MIR_insn_t)0x0);
        }
        _MIR_new_var_mem_op(local_458,ctx,MVar46,0,iVar56 + 0x22U,0xffffffff,'\x01');
        _MIR_new_var_op(ctx,MVar27);
        pMVar30 = MIR_new_insn(ctx,MVar45);
        MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar30);
        create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar30->insn_link).next,(MIR_insn_t)0x0);
        _MIR_new_var_op(ctx,iVar56 + 0x22U);
        MIR_new_int_op(ctx,uVar58);
        unaff_R14 = ctx;
        in_stack_fffffffffffff0f8 = local_4b8;
        in_stack_fffffffffffff108 = pMStack_4a8;
        in_stack_fffffffffffff118 = pMStack_498;
LAB_00157610:
        pMVar30 = MIR_new_insn(ctx,MIR_ALLOCA);
        MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar30);
        create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar30->insn_link).next,(MIR_insn_t)0x0);
      }
      else {
        if (MVar46 == (MIR_T_BLK|MIR_T_U8)) {
          if (local_d70 < 6) {
            MVar46 = MIR_T_I64;
            if (uVar58 < 9) goto LAB_00156ebf;
            if (local_d70 != 5) goto LAB_0015715b;
          }
LAB_0015703b:
          ptVar38 = gen_ctx->target_ctx;
          ptVar38->block_arg_func_p = '\x01';
          ptVar38->keep_fp_p = '\x01';
          _MIR_new_var_op(ctx,iVar56 + 0x22);
          _MIR_new_var_op(ctx,5);
          MIR_new_int_op(ctx,(long)&local_e70->c2mir_ctx +
                             (long)gen_ctx->target_ctx->start_sp_from_bp_offset);
          in_stack_fffffffffffff0f8 = local_638;
          in_stack_fffffffffffff108 = pMStack_628;
          in_stack_fffffffffffff118 = pMStack_618;
          pMVar30 = MIR_new_insn(ctx,MIR_ADD);
          local_e70 = (MIR_context_t)((long)&local_e70->gen_ctx + uVar58);
          MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar30);
          pMVar42 = (pMVar30->insn_link).next;
          unaff_R14 = local_e70;
        }
        else {
          if (((MVar46 - (MIR_T_BLK|MIR_T_U16) < 2) && (local_d70 < 6)) &&
             ((int)local_d78 != -0x11 && local_d78 < 8)) {
            MVar44 = (uint)(MVar46 != (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
            MVar46 = (uint)(MVar46 == (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
            MVar27 = get_arg_reg(MVar44,&local_d70,&local_d78,(MIR_insn_code_t *)local_cb8);
            MVar28 = get_arg_reg(MVar46,&local_d70,&local_d78,(MIR_insn_code_t *)&local_dd8);
            if (uVar58 != 0x10) {
              __assert_fail("blk_size > 8 && blk_size <= 16",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x2ea,"void target_machinize(gen_ctx_t)");
            }
            MVar45 = (MIR_insn_code_t)local_dd8;
            base = iVar56 + 0x22;
            _MIR_new_var_mem_op(local_518,ctx,MVar46,8,base,0xffffffff,'\x01');
            _MIR_new_var_op(ctx,MVar28);
            pMVar30 = MIR_new_insn(ctx,MVar45);
            MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar30);
            create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar30->insn_link).next,(MIR_insn_t)0x0);
            uVar64 = local_cb8._0_4_;
            _MIR_new_var_mem_op(local_578,ctx,MVar44,0,base,0xffffffff,'\x01');
            _MIR_new_var_op(ctx,MVar27);
            unaff_R14 = (MIR_context_t)MIR_new_insn(ctx,uVar64);
            MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,(MIR_insn_t_conflict)unaff_R14);
            create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(MIR_insn_t)unaff_R14->error_func,
                                (MIR_insn_t)0x0);
            _MIR_new_var_op(ctx,base);
            MIR_new_int_op(ctx,0x10);
            in_stack_fffffffffffff0f8 = local_5d8;
            in_stack_fffffffffffff108 = pMStack_5c8;
            in_stack_fffffffffffff118 = pMStack_5b8;
            goto LAB_00157610;
          }
          if (0xfffffffa < MVar46 - MIR_T_RBLK) goto LAB_0015703b;
          MVar27 = get_arg_reg(MVar46,&local_d70,&local_d78,&local_e2c);
          if (MVar27 == 0xffffffff) {
            MVar44 = MIR_T_I64;
            if ((MVar46 & ~MIR_T_U8) == MIR_T_F) {
              MVar44 = MVar46;
            }
            if (MVar46 == MIR_T_LD) {
              MVar44 = MVar46;
            }
            ptVar38 = gen_ctx->target_ctx;
            ptVar38->block_arg_func_p = '\x01';
            ptVar38->keep_fp_p = '\x01';
            if (MVar46 == MIR_T_F) {
              unaff_R14 = (MIR_context_t)&DAT_00000001;
            }
            else if (MVar46 == MIR_T_D) {
              unaff_R14 = (MIR_context_t)&DAT_00000002;
            }
            else {
              unaff_R14 = (MIR_context_t)(ulong)((uint)(MVar46 == MIR_T_LD) * 3);
            }
            local_e2c = (MIR_insn_code_t)unaff_R14;
            _MIR_new_var_mem_op((MIR_op_t *)local_cb8,ctx,MVar44,
                                (long)&local_e70->c2mir_ctx + (long)ptVar38->start_sp_from_bp_offset
                                ,5,0xffffffff,'\x01');
            pMStack_9a8 = (MIR_module_t)aStack_ca8._16_8_;
            pHStack_9a0 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
            pMStack_9c8 = (MIR_item_t_conflict)local_cb8._0_8_;
            pMStack_9c0 = (MIR_module_t_conflict)local_cb8._8_8_;
            local_9b8 = (MIR_func_t)aStack_ca8.i;
            pMStack_9b0 = (MIR_item_t_conflict)aStack_ca8.str.s;
            _MIR_new_var_op(ctx,iVar56 + 0x22);
            in_stack_fffffffffffff0f8 = local_6f8;
            in_stack_fffffffffffff108 = pMStack_6e8;
            in_stack_fffffffffffff118 = pMStack_6d8;
            pMVar30 = MIR_new_insn(ctx,(MIR_insn_code_t)unaff_R14);
            MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar30);
            create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar30->insn_link).next,(MIR_insn_t)0x0);
            local_e70 = (MIR_context_t)(&local_e70->c2mir_ctx + (MVar46 == MIR_T_LD));
            goto LAB_00157655;
          }
          _MIR_new_var_op(ctx,MVar27);
          MVar45 = local_e2c;
          pMStack_978 = (MIR_module_t)aStack_ca8._16_8_;
          pHStack_970 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
          pMStack_998 = (MIR_item_t_conflict)local_cb8._0_8_;
          pMStack_990 = (MIR_module_t_conflict)local_cb8._8_8_;
          local_988 = (MIR_func_t)aStack_ca8.i;
          pMStack_980 = (MIR_item_t_conflict)aStack_ca8.str.s;
          _MIR_new_var_op(ctx,iVar56 + 0x22);
          in_stack_fffffffffffff0f8 = local_6c8;
          in_stack_fffffffffffff108 = pMStack_6b8;
          in_stack_fffffffffffff118 = pMStack_6a8;
          pMVar30 = MIR_new_insn(ctx,MVar45);
          MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar30);
          pMVar42 = (pMVar30->insn_link).next;
          unaff_R14 = ctx;
        }
        create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,pMVar42,(MIR_insn_t)0x0);
      }
LAB_00157655:
      uVar47 = uVar47 + 1;
      lVar57 = lVar57 + 0x18;
    } while (uVar47 < local_e18->nargs);
    ptVar38 = gen_ctx->target_ctx;
  }
  ptVar38->alloca_p = '\0';
  ptVar38->leaf_p = '\x01';
  before = (MIR_context_t)(local_e18->insns).head;
  if (before != (MIR_context_t)0x0) {
    local_b90 = (undefined8 *)(local_c20 + 2);
    do {
      MVar45 = before->func_redef_permission_p;
      pMVar37 = (MIR_context_t)before->error_func;
      switch(MVar45) {
      case MIR_UI2F:
      case MIR_UI2D:
      case MIR_UI2LD:
      case MIR_LD2I:
        pMVar34 = (MIR_item_t_conflict)before->insn_nops;
        uVar7 = *(undefined2 *)&before->unspec_protos;
        uStack_d48 = (undefined6)((ulong)before->module_item_tab >> 0x10);
        local_d68 = *(MIR_item_t_conflict *)((long)&before->unspec_protos + 2);
        pMStack_d60 = *(MIR_module_t_conflict *)((long)&before->temp_string + 2);
        pMStack_d58 = *(MIR_func_t *)((long)&before->temp_data + 2);
        uVar62 = *(undefined8 *)((long)&before->used_label_p + 2);
        uStack_d50 = (undefined6)uVar62;
        uStack_d4a = (undefined2)((ulong)uVar62 >> 0x30);
        pMVar35 = (MIR_item_t_conflict)(before->environment_module).data;
        uVar8 = *(ushort *)&(before->environment_module).name;
        uStack_cf8 = (undefined6)((ulong)(before->environment_module).module_link.next >> 0x10);
        pMStack_d18 = *(MIR_item_t_conflict *)((long)&(before->environment_module).name + 2);
        pMStack_d10 = *(MIR_module_t_conflict *)((long)&(before->environment_module).items.head + 2)
        ;
        local_d08 = *(MIR_func_t *)((long)&(before->environment_module).items.tail + 2);
        uVar62 = *(undefined8 *)((long)&(before->environment_module).module_link.prev + 2);
        uStack_d00 = (undefined6)uVar62;
        uStack_cfa = (undefined2)((ulong)uVar62 >> 0x30);
        get_builtin(gen_ctx,MVar45,&local_ab8,(MIR_item_t_conflict *)&local_b48);
        if (((char)uVar7 != '\x02') || ((uVar8 & 0xff) != 2)) {
LAB_0015acd8:
          __assert_fail("res_reg_op.mode == MIR_OP_VAR && op_reg_op.mode == MIR_OP_VAR",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x349,"void target_machinize(gen_ctx_t)");
        }
        MVar27 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func);
        uVar29 = MVar27 + 0x21;
        if ((uVar29 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar29)) {
          gen_ctx->curr_cfg->max_var = uVar29;
        }
        _MIR_new_var_op(ctx,uVar29);
        pMStack_dc0 = (MIR_item_t_conflict)CONCAT71(uStack_ccf,uStack_cd0);
        local_db8 = (MIR_reg_t)CONCAT71(uStack_cc7,uStack_cc8);
        uStack_db4 = (undefined4)((uint7)uStack_cc7 >> 0x18);
        local_db0 = pHStack_cc0;
        local_dd8 = local_ce8;
        pMStack_dd0 = uStack_ce0;
        bStack_dc8 = bStack_cd8;
        uStack_dc7 = uStack_cd7;
        MIR_new_ref_op(ctx,(MIR_item_t_conflict)local_b48.data);
        in_stack_fffffffffffff108 = CONCAT71(uStack_dc7,bStack_dc8);
        in_stack_fffffffffffff118 = CONCAT44(uStack_db4,local_db8);
        in_stack_fffffffffffff0f8 = local_dd8;
        pMVar37 = (MIR_context_t)MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_before(gen_ctx,(MIR_insn_t)before,(MIR_insn_t)pMVar37);
        MIR_new_ref_op(ctx,local_ab8);
        puVar22 = local_b90;
        aStack_ca8._16_8_ = CONCAT71(uStack_cc7,uStack_cc8);
        aStack_ca8.i = CONCAT71(uStack_cd7,bStack_cd8);
        aStack_ca8.str.s = (char *)CONCAT71(uStack_ccf,uStack_cd0);
        auVar20._1_7_ = uStack_dc7;
        auVar20[0] = bStack_dc8;
        auVar20._8_8_ = pMStack_dc0;
        auVar20._16_4_ = local_db8;
        auVar20._20_4_ = uStack_db4;
        auVar20._24_8_ = local_db0;
        aStack_ca8.mem.disp = (MIR_disp_t)pHStack_cc0;
        local_cb8._0_8_ = local_ce8;
        local_cb8._8_8_ = uStack_ce0;
        pMStack_c78._1_7_ = uStack_dc7;
        pMStack_c78._0_1_ = bStack_dc8;
        local_c88 = local_dd8;
        pMStack_c80 = pMStack_dd0;
        auStack_c68 = auVar20._16_16_;
        pMStack_c70 = pMStack_dc0;
        uStack_c2e = uStack_d48;
        uStack_c4e = SUB86(local_d68,0);
        local_c48 = (undefined2)((ulong)local_d68 >> 0x30);
        uStack_c46 = SUB86(pMStack_d60,0);
        uStack_c40 = (undefined2)((ulong)pMStack_d60 >> 0x30);
        uStack_c3e = SUB86(pMStack_d58,0);
        uStack_c38 = (undefined2)((ulong)pMStack_d58 >> 0x30);
        uStack_c36 = uStack_d50;
        uStack_c30 = uStack_d4a;
        local_c20._0_2_ = uVar8;
        *(ulong *)((long)local_b90 + 0x1e) = CONCAT62(uStack_cf8,uStack_cfa);
        *puVar22 = pMStack_d18;
        puVar22[1] = pMStack_d10;
        puVar22[2] = local_d08;
        puVar22[3] = CONCAT26(uStack_cfa,uStack_d00);
        local_c58 = pMVar34;
        local_c50 = uVar7;
        local_c28 = pMVar35;
        pMVar30 = MIR_new_insn_arr(ctx,MIR_CALL,4,(MIR_op_t *)local_cb8);
        gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
        unaff_R14 = before;
LAB_00158219:
        gen_delete_insn(gen_ctx,(MIR_insn_t)before);
        goto switchD_001578ac_caseD_58;
      case MIR_F2I:
      case MIR_D2I:
      case MIR_F2D:
      case MIR_F2LD:
      case MIR_D2F:
      case MIR_D2LD:
      case MIR_LD2F:
      case MIR_LD2D:
      case MIR_NEG:
      case MIR_NEGS:
      case MIR_FNEG:
      case MIR_DNEG:
      case MIR_LDNEG:
      case MIR_ADDR:
      case MIR_ADDR8:
      case MIR_ADDR16:
      case MIR_ADDR32:
      case MIR_ADD:
      case MIR_ADDS:
      case MIR_FADD:
      case MIR_DADD:
      case MIR_LDADD:
      case MIR_SUB:
      case MIR_SUBS:
      case MIR_FSUB:
      case MIR_DSUB:
      case MIR_LDSUB:
      case MIR_MUL:
      case MIR_MULS:
      case MIR_FMUL:
      case MIR_DMUL:
      case MIR_LDMUL:
      case MIR_FDIV:
      case MIR_DDIV:
      case MIR_LDDIV:
      case MIR_AND:
      case MIR_ANDS:
      case MIR_OR:
      case MIR_ORS:
      case MIR_XOR:
      case MIR_XORS:
      case MIR_LDEQ:
      case MIR_LDNE:
      case MIR_LDGT:
      case MIR_LDGE:
      case MIR_ADDO:
      case MIR_ADDOS:
      case MIR_SUBO:
      case MIR_SUBOS:
      case MIR_MULO:
      case MIR_MULOS:
      case MIR_JMP:
      case MIR_BT:
      case MIR_BTS:
      case MIR_BF:
      case MIR_BFS:
      case MIR_BEQ:
      case MIR_BEQS:
      case MIR_FBEQ:
      case MIR_DBEQ:
      case MIR_LDBEQ:
      case MIR_BNE:
      case MIR_BNES:
      case MIR_FBNE:
      case MIR_DBNE:
      case MIR_LDBNE:
      case MIR_BLT:
      case MIR_BLTS:
      case MIR_UBLT:
      case MIR_UBLTS:
      case MIR_BLE:
      case MIR_BLES:
      case MIR_UBLE:
      case MIR_UBLES:
switchD_00157848_caseD_10:
        if (0xfffffffc < MVar45 - MIR_SWITCH) {
          unaff_R14 = gen_ctx->ctx;
          local_d20 = (gen_ctx->curr_func_item->u).func;
          pcVar48 = before->temp_string[2].varr;
          local_e28 = pMVar37;
          local_d28 = MIR_insn_nops(unaff_R14,(MIR_insn_t_conflict)before);
          iVar56 = *(int *)(pcVar48 + 8);
          local_d88 = 0;
          local_d90 = 0;
          pMVar42 = (MIR_insn_t)before->c2mir_ctx;
          local_e20 = pcVar48;
          if (pMVar42 == (MIR_insn_t)0x0) {
            __assert_fail("prev_call_insn != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0xc0,"void machinize_call(gen_ctx_t, MIR_insn_t)");
          }
          if ((int)*(ulong *)&before->func_redef_permission_p == 0xa8) {
            *(ulong *)&before->func_redef_permission_p =
                 *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0xa7;
          }
          uVar47 = (ulong)(iVar56 + 2);
          puVar11 = *(ulong **)(pcVar48 + 0x20);
          if (puVar11 == (ulong *)0x0) {
            local_b98 = 0;
            local_d30 = 0;
          }
          else {
            local_d30 = *puVar11;
            if ((local_d28 < local_d30) ||
               ((pcVar48[0x18] == '\0' && (local_d28 - uVar47 != local_d30)))) {
              __assert_fail("nops >= (VARR_MIR_var_tlength (proto->args)) && (proto->vararg_p || nops - start == (VARR_MIR_var_tlength (proto->args)))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0xc6,"void machinize_call(gen_ctx_t, MIR_insn_t)");
            }
            local_b98 = puVar11[2];
          }
          cVar4 = *(char *)&(before->environment_module).name;
          if ((cVar4 != '\x02') && (cVar4 != '\b')) {
            MVar27 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_d20);
            uVar29 = MVar27 + 0x21;
            if ((uVar29 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar29)) {
              gen_ctx->curr_cfg->max_var = uVar29;
            }
            _MIR_new_var_op(unaff_R14,uVar29);
            uStack_d48 = (undefined6)aStack_ca8._16_8_;
            uStack_d42 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
            pHStack_d40 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
            local_d68 = (MIR_item_t_conflict)local_cb8._0_8_;
            pMStack_d60 = (MIR_module_t_conflict)local_cb8._8_8_;
            pMStack_d58 = (MIR_func_t)aStack_ca8.i;
            uStack_d50 = SUB86(aStack_ca8.str.s,0);
            uStack_d4a = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
            in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
            in_stack_fffffffffffff108 = aStack_ca8.i;
            in_stack_fffffffffffff118 = aStack_ca8._16_8_;
            pMVar30 = MIR_new_insn(unaff_R14,MIR_MOV);
            (before->environment_module).data = local_d68;
            (before->environment_module).name = (char *)pMStack_d60;
            (before->environment_module).items.head = (MIR_item_t_conflict)pMStack_d58;
            (before->environment_module).items.tail =
                 (MIR_item_t_conflict)CONCAT26(uStack_d4a,uStack_d50);
            (before->environment_module).items.head = (MIR_item_t_conflict)pMStack_d58;
            (before->environment_module).items.tail =
                 (MIR_item_t_conflict)CONCAT26(uStack_d4a,uStack_d50);
            (before->environment_module).module_link.prev =
                 (MIR_module_t)CONCAT26(uStack_d42,uStack_d48);
            (before->environment_module).module_link.next = (MIR_module_t)pHStack_d40;
            gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          }
          local_e10 = before;
          if (uVar47 < local_d28) {
            local_b58 = &before->insn_nops;
            uVar58 = 0;
            local_e60 = 0;
            uVar52 = uVar47;
            local_da0 = uVar47;
            do {
              uVar64 = (undefined4)((ulong)in_stack_fffffffffffff0f8 >> 0x20);
              uVar65 = (undefined4)((ulong)in_stack_fffffffffffff108 >> 0x20);
              uVar66 = (undefined4)((ulong)in_stack_fffffffffffff118 >> 0x20);
              local_dd8 = (MIR_item_t_conflict)local_b58[uVar47 * 6];
              pMStack_dd0 = (MIR_module_t_conflict)(local_b58 + uVar47 * 6)[1];
              ppVVar3 = local_b58 + uVar47 * 6 + 2;
              pVVar16 = *ppVVar3;
              pMStack_dc0 = (MIR_item_t_conflict)ppVVar3[1];
              local_db0 = (HTAB_MIR_item_t *)ppVVar3[3];
              ppVVar2 = local_b58 + uVar47 * 6;
              bStack_dc8 = (byte)pVVar16;
              uStack_dc7 = (undefined7)((ulong)pVVar16 >> 8);
              local_db8 = (MIR_reg_t)(VARR_char *)ppVVar3[2];
              uStack_db4 = (undefined4)((ulong)ppVVar3[2] >> 0x20);
              local_d98 = uVar58;
              local_b50 = uVar47;
              if ((char)pMStack_dd0 == '\x02') {
                uVar47 = uVar47 - uVar52;
                if (uVar47 < local_d30) goto LAB_001592be;
LAB_00159406:
                uVar8 = *(ushort *)(ppVVar2 + 1) >> 8;
                if (4 < (ushort)(uVar8 - 3)) {
                  __assert_fail("mode == MIR_OP_INT || mode == MIR_OP_UINT || mode == MIR_OP_FLOAT || mode == MIR_OP_DOUBLE || mode == MIR_OP_LDOUBLE"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                ,0xdf,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                }
                if (uVar8 == 6) {
                  uVar51 = 9;
                }
                else if (uVar8 == 7) {
                  uVar51 = 10;
                }
                else {
                  if (uVar8 == 5) {
                    p_Var39 = MIR_get_error_func(unaff_R14);
                    pcVar48 = "passing float variadic arg (should be passed as double)";
                    MVar50 = MIR_call_op_error;
                    goto LAB_0015acd1;
                  }
                  uVar51 = 6;
                }
                bVar60 = ((uint)uVar51 & 0xfffffffe) == 8;
                local_e61 = uVar58 < 8 && bVar60;
LAB_00159465:
                pMVar33 = (MIR_insn_t)0x0;
              }
              else {
                if (((char)pMStack_dd0 != '\v') ||
                   (uVar51 = (ulong)pVVar16 & 0xff, bStack_dc8 - 0x12 < 0xfffffffa)) {
                  __assert_fail("arg_op.mode == MIR_OP_VAR || (arg_op.mode == MIR_OP_VAR_MEM && MIR_all_blk_type_p (arg_op.u.var_mem.type))"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                ,0xd6,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                }
                uVar47 = uVar47 - uVar52;
                if (uVar47 < local_d30) {
LAB_001592be:
                  uVar51 = (ulong)*(uint *)(local_b98 + uVar47 * 0x18);
                }
                else if (((ushort)pMStack_dd0 & 0xff) != 0xb) goto LAB_00159406;
                bVar60 = ((uint)uVar51 & 0xfffffffe) == 8;
                local_e61 = uVar58 < 8 && bVar60;
                if (5 < (uint)uVar51) goto LAB_00159465;
                MVar45 = *(MIR_insn_code_t *)(&DAT_001b1a60 + uVar51 * 4);
                MVar27 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_d20);
                uVar29 = MVar27 + 0x21;
                if ((uVar29 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar29)) {
                  gen_ctx->curr_cfg->max_var = uVar29;
                }
                _MIR_new_var_op(unaff_R14,uVar29);
                uStack_d48 = (undefined6)aStack_ca8._16_8_;
                uStack_d42 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                pHStack_d40 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
                local_d68 = (MIR_item_t_conflict)local_cb8._0_8_;
                pMStack_d60 = (MIR_module_t_conflict)local_cb8._8_8_;
                pMStack_d58 = (MIR_func_t)aStack_ca8.i;
                uStack_d50 = SUB86(aStack_ca8.str.s,0);
                uStack_d4a = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                pMVar34 = (MIR_item_t_conflict)local_cb8._0_8_;
                uVar62 = aStack_ca8.i;
                uVar63 = aStack_ca8._16_8_;
                pMVar33 = MIR_new_insn(unaff_R14,MVar45);
                uVar64 = (undefined4)((ulong)pMVar34 >> 0x20);
                uVar65 = (undefined4)((ulong)uVar62 >> 0x20);
                uVar66 = (undefined4)((ulong)uVar63 >> 0x20);
                pMStack_dc0 = (MIR_item_t_conflict)CONCAT26(uStack_d4a,uStack_d50);
                local_dd8 = local_d68;
                pMStack_dd0 = pMStack_d60;
                bStack_dc8 = (byte)pMStack_d58;
                uStack_dc7 = (undefined7)((ulong)pMStack_d58 >> 8);
                local_db8 = (MIR_reg_t)uStack_d48;
                uStack_db4 = (undefined4)(CONCAT26(uStack_d42,uStack_d48) >> 0x20);
                local_db0 = pHStack_d40;
                ppVVar2[2] = (VARR_size_t *)pMStack_d58;
                ppVVar2[3] = (VARR_size_t *)pMStack_dc0;
                ppVVar2[4] = (VARR_size_t *)CONCAT26(uStack_d42,uStack_d48);
                ppVVar2[5] = (VARR_size_t *)pHStack_d40;
                *ppVVar2 = (VARR_size_t *)local_d68;
                ppVVar2[1] = (VARR_size_t *)pMStack_d60;
                ppVVar2[2] = (VARR_size_t *)pMStack_d58;
                ppVVar2[3] = (VARR_size_t *)CONCAT26(uStack_d4a,uStack_d50);
              }
              uVar58 = local_d98;
              MVar46 = (MIR_type_t)uVar51;
              if (MVar46 - MIR_T_RBLK < 0xfffffffb) {
                local_e70 = (MIR_context_t)0x0;
              }
              else {
                if ((char)pMStack_dd0 != '\v') {
                  __assert_fail("arg_op.mode == MIR_OP_VAR_MEM",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                ,0xee,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                }
                puVar1 = (undefined1 *)((long)&local_db0->els_start + 3);
                puVar43 = (undefined1 *)((long)&local_db0->collisions + 2);
                if (-1 < (long)puVar1) {
                  puVar43 = puVar1;
                }
                local_e70 = (MIR_context_t)((ulong)puVar43 & 0xfffffffffffffff8);
              }
              if (MVar46 == (MIR_T_BLK|MIR_T_I16)) {
                if ((int)local_d90 != -0x11 && local_d90 < 8) {
                  MVar44 = MIR_T_D;
                  if (local_e70 < 9) {
LAB_0015952b:
                    MVar27 = get_arg_reg(MVar44,&local_d88,&local_d90,(MIR_insn_code_t *)local_cb8);
                  }
                  else {
                    MVar44 = MIR_T_D;
                    if (6 < local_d90) goto LAB_001596ef;
LAB_00159ebd:
                    MVar27 = get_arg_reg(MVar44,&local_d88,&local_d90,(MIR_insn_code_t *)local_cb8);
                    if (0x10 < local_e70) {
                      __assert_fail("size <= 16",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                    ,0xfc,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                    }
                  }
                  uVar64 = local_cb8._0_4_;
                  _MIR_new_var_op(unaff_R14,MVar27);
                  _MIR_new_var_mem_op(&local_b48,unaff_R14,MVar44,0,local_db8,0xffffffff,'\x01');
                  in_stack_fffffffffffff118 = CONCAT26(uStack_a92,uStack_a98);
                  in_stack_fffffffffffff0f8 = local_ab8;
                  in_stack_fffffffffffff108 = pMStack_aa8;
                  pMVar30 = MIR_new_insn(unaff_R14,uVar64);
                  gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
                  setup_call_hard_reg_args(gen_ctx,(MIR_insn_t)before,MVar27);
                  *(undefined4 *)(ppVVar2 + 4) = 0xffffffff;
                  uVar52 = local_da0;
                  uVar58 = local_d98;
                  if (8 < local_e70) {
                    MVar27 = get_arg_reg(MVar44,&local_d88,&local_d90,(MIR_insn_code_t *)local_cb8);
                    uVar64 = local_cb8._0_4_;
                    _MIR_new_var_op(unaff_R14,MVar27);
                    _MIR_new_var_mem_op(&local_a28,unaff_R14,MVar44,8,local_db8,0xffffffff,'\x01');
                    in_stack_fffffffffffff0f8 = local_9f8[0];
                    in_stack_fffffffffffff108 = pMStack_9e8;
                    in_stack_fffffffffffff118 = pMStack_9d8;
                    pMVar30 = MIR_new_insn(unaff_R14,uVar64);
                    gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
                    setup_call_hard_reg_args(gen_ctx,(MIR_insn_t)before,MVar27);
                    uVar52 = local_da0;
                    uVar58 = local_d98;
                  }
                  goto LAB_0015a5ad;
                }
LAB_001596ef:
                if ((long)local_e70 - 1U < 0x10) {
                  MVar27 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_d20);
                  uVar29 = MVar27 + 0x21;
                  if ((uVar29 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar29)) {
                    gen_ctx->curr_cfg->max_var = uVar29;
                  }
                  _MIR_new_var_op(unaff_R14,uVar29);
                  bVar60 = false;
                  uVar47 = 0;
                  uStack_d48 = (undefined6)aStack_ca8._16_8_;
                  uStack_d42 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                  pHStack_d40 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
                  local_d68 = (MIR_item_t_conflict)local_cb8._0_8_;
                  pMStack_d60 = (MIR_module_t_conflict)local_cb8._8_8_;
                  pMStack_d58 = (MIR_func_t)aStack_ca8.i;
                  uStack_d50 = SUB86(aStack_ca8.str.s,0);
                  uStack_d4a = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                  do {
                    _MIR_new_var_mem_op((MIR_op_t *)local_cb8,unaff_R14,MIR_T_I64,uVar47,local_db8,
                                        0xffffffff,'\x01');
                    uStack_cf8 = (undefined6)aStack_ca8._16_8_;
                    uStack_cf2 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                    pHStack_cf0 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
                    pMStack_d18 = (MIR_item_t_conflict)local_cb8._0_8_;
                    pMStack_d10 = (MIR_module_t_conflict)local_cb8._8_8_;
                    local_d08 = (MIR_func_t)aStack_ca8.i;
                    uStack_d00 = SUB86(aStack_ca8.str.s,0);
                    uStack_cfa = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                    pMVar30 = MIR_new_insn(unaff_R14,MIR_MOV);
                    gen_add_insn_after(gen_ctx,pMVar42,pMVar30);
                    _MIR_new_var_mem_op((MIR_op_t *)local_cb8,unaff_R14,MIR_T_I64,local_e60 + uVar47
                                        ,4,0xffffffff,'\x01');
                    uStack_cf8 = (undefined6)aStack_ca8._16_8_;
                    uStack_cf2 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                    pHStack_cf0 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
                    pMStack_d18 = (MIR_item_t_conflict)local_cb8._0_8_;
                    pMStack_d10 = (MIR_module_t_conflict)local_cb8._8_8_;
                    local_d08 = (MIR_func_t)aStack_ca8.i;
                    uStack_d00 = SUB86(aStack_ca8.str.s,0);
                    uStack_cfa = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                    in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
                    in_stack_fffffffffffff108 = aStack_ca8.i;
                    in_stack_fffffffffffff118 = aStack_ca8._16_8_;
                    pMVar36 = MIR_new_insn(unaff_R14,MIR_MOV);
                    gen_add_insn_after(gen_ctx,pMVar30,pMVar36);
                    if (!bVar60) {
                      in_stack_fffffffffffff0f8 =
                           (MIR_item_t_conflict)
                           CONCAT44((int)((ulong)in_stack_fffffffffffff0f8 >> 0x20),1);
                      _MIR_new_var_mem_op((MIR_op_t *)local_cb8,unaff_R14,MVar46,local_e60 + uVar47,
                                          4,0xffffffff,'\x01');
                      ppVVar2[2] = (VARR_size_t *)aStack_ca8.i;
                      ppVVar2[3] = (VARR_size_t *)aStack_ca8.str.s;
                      ppVVar2[4] = (VARR_size_t *)aStack_ca8._16_8_;
                      ppVVar2[5] = (VARR_size_t *)aStack_ca8.mem.disp;
                      *ppVVar2 = (VARR_size_t *)local_cb8._0_8_;
                      ppVVar2[1] = (VARR_size_t *)local_cb8._8_8_;
                      ppVVar2[2] = (VARR_size_t *)aStack_ca8.i;
                      ppVVar2[3] = (VARR_size_t *)aStack_ca8.str.s;
                    }
                    uVar47 = uVar47 + 8;
                    bVar60 = true;
                  } while (local_e70 != (MIR_context_t)uVar47);
                  before = local_e10;
                  uVar52 = local_da0;
                  uVar58 = local_d98;
                  local_e60 = local_e60 + uVar47;
                }
                else {
                  pMVar34 = _MIR_builtin_proto(unaff_R14,gen_ctx->curr_func_item->module,
                                               "mir.arg_memcpy.p",0,(MIR_type_t *)0x0,3,
                                               CONCAT44(uVar64,6),"dest",CONCAT44(uVar65,6),"src",
                                               CONCAT44(uVar66,6),"n");
                  pMVar35 = _MIR_builtin_func(unaff_R14,gen_ctx->curr_func_item->module,
                                              "mir.arg_memcpy",memcpy);
                  MVar27 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,
                                             (gen_ctx->curr_func_item->u).func);
                  uVar29 = MVar27 + 0x21;
                  if ((uVar29 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar29)) {
                    gen_ctx->curr_cfg->max_var = uVar29;
                  }
                  _MIR_new_var_op(unaff_R14,uVar29);
                  MVar27 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,
                                             (gen_ctx->curr_func_item->u).func);
                  uVar29 = MVar27 + 0x21;
                  if ((uVar29 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar29)) {
                    gen_ctx->curr_cfg->max_var = uVar29;
                  }
                  _MIR_new_var_op(unaff_R14,uVar29);
                  pMStack_af8 = (MIR_module_t)aStack_b78._16_8_;
                  pHStack_af0 = (HTAB_MIR_item_t *)aStack_b78.mem.disp;
                  local_b18 = (MIR_item_t_conflict)local_b88._0_8_;
                  pMStack_b10 = (MIR_module_t_conflict)local_b88._8_8_;
                  pMStack_b08 = (MIR_func_t)aStack_b78.i;
                  pMStack_b00 = (MIR_item_t_conflict)aStack_b78.str.s;
                  MIR_new_ref_op(unaff_R14,pMVar34);
                  auVar21._8_8_ = uStack_a70;
                  auVar21._0_8_ = pMStack_a78;
                  auVar21._16_8_ = pMStack_a68;
                  auVar21._24_8_ = uStack_a60;
                  aStack_ca8._16_8_ = aStack_b78._16_8_;
                  aStack_ca8.mem.disp = aStack_b78.mem.disp;
                  local_cb8._0_8_ = local_b88._0_8_;
                  local_cb8._8_8_ = local_b88._8_8_;
                  aStack_ca8.i = aStack_b78.i;
                  aStack_ca8.str.s = aStack_b78.str.s;
                  local_c88 = (MIR_item_t_conflict)CONCAT44(uStack_a84,local_a88);
                  pMStack_c80 = pMStack_a80;
                  auStack_c68 = auVar21._16_16_;
                  pMStack_c70 = (MIR_item_t_conflict)uStack_a70;
                  pMStack_c78 = pMStack_a78;
                  _MIR_new_var_op(unaff_R14,7);
                  uStack_c38 = (undefined2)aStack_b78._16_8_;
                  uStack_c36 = (undefined6)((ulong)aStack_b78._16_8_ >> 0x10);
                  uStack_c30 = (undefined2)aStack_b78.mem.disp;
                  uStack_c2e = (undefined6)((ulong)aStack_b78._24_8_ >> 0x10);
                  local_c58 = (MIR_item_t_conflict)local_b88._0_8_;
                  local_c50 = (undefined2)local_b88._8_8_;
                  uStack_c4e = SUB86(local_b88._8_8_,2);
                  local_c48 = (undefined2)aStack_b78.i;
                  uStack_c46 = (undefined6)((ulong)aStack_b78._0_8_ >> 0x10);
                  uStack_c40 = SUB82(aStack_b78.str.s,0);
                  uStack_c3e = (undefined6)((ulong)aStack_b78._8_8_ >> 0x10);
                  _MIR_new_var_op(unaff_R14,6);
                  pMStack_c08 = (MIR_module_t)aStack_b78._16_8_;
                  pHStack_c00 = (HTAB_MIR_item_t *)aStack_b78.mem.disp;
                  local_c28 = (MIR_item_t_conflict)local_b88._0_8_;
                  local_c20 = (undefined1  [8])local_b88._8_8_;
                  local_c18 = (MIR_func_t)aStack_b78.i;
                  pMStack_c10 = (MIR_item_t_conflict)aStack_b78.str.s;
                  _MIR_new_var_op(unaff_R14,2);
                  uStack_bd8 = (undefined1)aStack_b78._16_8_;
                  uStack_bd7 = (undefined7)((ulong)aStack_b78._16_8_ >> 8);
                  pHStack_bd0 = (HTAB_MIR_item_t *)aStack_b78.mem.disp;
                  local_bf8 = (MIR_item_t_conflict)local_b88._0_8_;
                  local_bf0 = (MIR_module_t_conflict)local_b88._8_8_;
                  local_be8 = (byte)aStack_b78.i;
                  uStack_be7 = (undefined7)((ulong)aStack_b78._0_8_ >> 8);
                  uStack_be0 = SUB81(aStack_b78.str.s,0);
                  uStack_bdf = (undefined7)((ulong)aStack_b78._8_8_ >> 8);
                  pMVar30 = MIR_new_insn_arr(unaff_R14,MIR_CALL,5,(MIR_op_t *)local_cb8);
                  gen_add_insn_after(gen_ctx,pMVar42,pMVar30);
                  MIR_new_int_op(unaff_R14,(int64_t)local_e70);
                  pMVar30 = MIR_new_insn(unaff_R14,MIR_MOV);
                  gen_add_insn_after(gen_ctx,pMVar42,pMVar30);
                  _MIR_new_var_op(unaff_R14,local_db8);
                  pMVar30 = MIR_new_insn(unaff_R14,MIR_MOV);
                  gen_add_insn_after(gen_ctx,pMVar42,pMVar30);
                  pMVar30 = MIR_new_insn(unaff_R14,MIR_MOV);
                  gen_add_insn_after(gen_ctx,pMVar42,pMVar30);
                  _MIR_new_var_op(unaff_R14,4);
                  MIR_new_int_op(unaff_R14,local_e60);
                  pMVar30 = MIR_new_insn(unaff_R14,MIR_ADD);
                  gen_add_insn_after(gen_ctx,pMVar42,pMVar30);
                  MIR_new_ref_op(unaff_R14,pMVar35);
                  pMVar34 = local_c88;
                  in_stack_fffffffffffff108 = pMStack_c78;
                  in_stack_fffffffffffff118 = auStack_c68._0_8_;
                  pMVar30 = MIR_new_insn(unaff_R14,MIR_MOV);
                  uVar64 = (undefined4)((ulong)pMVar34 >> 0x20);
                  gen_add_insn_after(gen_ctx,pMVar42,pMVar30);
                  in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)CONCAT44(uVar64,1);
                  _MIR_new_var_mem_op((MIR_op_t *)local_b88,unaff_R14,MIR_T_BLK,
                                      (MIR_disp_t)local_db0,uVar29,0xffffffff,'\x01');
                  ppVVar2[2] = (VARR_size_t *)aStack_b78.i;
                  ppVVar2[3] = (VARR_size_t *)aStack_b78.str.s;
                  ppVVar2[4] = (VARR_size_t *)aStack_b78._16_8_;
                  ppVVar2[5] = (VARR_size_t *)aStack_b78.mem.disp;
                  *ppVVar2 = (VARR_size_t *)local_b88._0_8_;
                  ppVVar2[1] = (VARR_size_t *)local_b88._8_8_;
                  ppVVar2[2] = (VARR_size_t *)aStack_b78.i;
                  ppVVar2[3] = (VARR_size_t *)aStack_b78.str.s;
                  before = local_e10;
                  uVar52 = local_da0;
                  uVar58 = local_d98;
                  local_e60 = (long)local_e70 + local_e60;
                }
              }
              else {
                if (MVar46 == (MIR_T_BLK|MIR_T_U8)) {
                  if (local_d88 < 6) {
                    MVar44 = MIR_T_I64;
                    if (local_e70 < 9) goto LAB_0015952b;
                    MVar44 = MIR_T_I64;
                    if (local_d88 != 5) goto LAB_00159ebd;
                  }
                  goto LAB_001596ef;
                }
                if (((MVar46 - (MIR_T_BLK|MIR_T_U16) < 2) && (local_d88 < 6)) &&
                   ((int)local_d90 != -0x11 && local_d90 < 8)) {
                  MVar44 = (uint)(MVar46 != (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
                  MVar46 = (uint)(MVar46 == (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
                  MVar27 = get_arg_reg(MVar44,&local_d88,&local_d90,(MIR_insn_code_t *)local_cb8);
                  MVar28 = get_arg_reg(MVar46,&local_d88,&local_d90,&local_a88);
                  if (local_e70 != (MIR_context_t)0x10) {
                    __assert_fail("size > 8 && size <= 16",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                  ,0x116,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                  }
                  uVar64 = local_cb8._0_4_;
                  _MIR_new_var_op(unaff_R14,MVar27);
                  _MIR_new_var_mem_op(&local_68,unaff_R14,MVar44,0,local_db8,0xffffffff,'\x01');
                  pMVar30 = MIR_new_insn(unaff_R14,uVar64);
                  before = local_e10;
                  setup_call_hard_reg_args(gen_ctx,(MIR_insn_t)local_e10,MVar27);
                  *(undefined4 *)(ppVVar2 + 4) = 0xffffffff;
                  gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
                  MVar45 = local_a88;
                  _MIR_new_var_op(unaff_R14,MVar28);
                  _MIR_new_var_mem_op(&local_c8,unaff_R14,MVar46,8,local_db8,0xffffffff,'\x01');
                  in_stack_fffffffffffff0f8 = local_98;
                  in_stack_fffffffffffff108 = pMStack_88;
                  in_stack_fffffffffffff118 = pMStack_78;
                  pMVar30 = MIR_new_insn(unaff_R14,MVar45);
                  gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
                  setup_call_hard_reg_args(gen_ctx,(MIR_insn_t)before,MVar28);
                  uVar52 = local_da0;
                  uVar58 = local_d98;
                }
                else {
                  if (0xfffffffa < MVar46 - MIR_T_RBLK) goto LAB_001596ef;
                  MVar27 = get_arg_reg(MVar46,&local_d88,&local_d90,&local_d7c);
                  if (MVar27 == 0xffffffff) {
                    if (MVar46 == MIR_T_RBLK) {
                      if ((char)pMStack_dd0 != '\v') {
                        __assert_fail("arg_op.mode == MIR_OP_VAR_MEM",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                      ,0x1b1,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                      }
                      _MIR_new_var_op(unaff_R14,local_db8);
                      local_e50 = 0;
                      MVar44 = MIR_T_I64;
                      if (bVar60) {
                        MVar44 = MIR_T_RBLK;
                      }
                      MVar45 = MIR_MOV;
                      local_db8 = (MIR_reg_t)aStack_ca8._16_8_;
                      uStack_db4 = (undefined4)((ulong)aStack_ca8._16_8_ >> 0x20);
                      local_db0 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
                      local_dd8 = (MIR_item_t_conflict)local_cb8._0_8_;
                      pMStack_dd0 = (MIR_module_t_conflict)local_cb8._8_8_;
                      bStack_dc8 = (byte)aStack_ca8.i;
                      uStack_dc7 = (undefined7)((ulong)aStack_ca8._0_8_ >> 8);
                      pMStack_dc0 = (MIR_item_t_conflict)aStack_ca8.str.s;
                    }
                    else {
                      uVar29 = CONCAT31(0xffffff,MVar46 == MIR_T_LD);
                      MVar44 = MIR_T_I64;
                      if (MVar46 == MIR_T_LD) {
                        MVar44 = MVar46;
                      }
                      if (bVar60) {
                        MVar44 = MVar46;
                      }
                      if (MVar46 == MIR_T_F) {
                        MVar45 = MIR_FMOV;
                        local_e50 = (ulong)uVar29;
                      }
                      else if (MVar46 == MIR_T_D) {
                        MVar45 = MIR_DMOV;
                        local_e50 = 0;
                      }
                      else {
                        local_e50 = (ulong)uVar29;
                        MVar45 = (uint)(MVar46 == MIR_T_LD) * 3;
                      }
                    }
                    local_d7c = MVar45;
                    _MIR_new_var_mem_op((MIR_op_t *)local_cb8,unaff_R14,MVar44,local_e60,4,
                                        0xffffffff,'\x01');
                    uStack_cf8 = (undefined6)aStack_ca8._16_8_;
                    uStack_cf2 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                    pHStack_cf0 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
                    pMStack_d18 = (MIR_item_t_conflict)local_cb8._0_8_;
                    pMStack_d10 = (MIR_module_t_conflict)local_cb8._8_8_;
                    local_d08 = (MIR_func_t)aStack_ca8.i;
                    uStack_d00 = SUB86(aStack_ca8.str.s,0);
                    uStack_cfa = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                    in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
                    in_stack_fffffffffffff108 = aStack_ca8.i;
                    in_stack_fffffffffffff118 = aStack_ca8._16_8_;
                    pMVar30 = MIR_new_insn(unaff_R14,MVar45);
                    MIR_insert_insn_after(unaff_R14,gen_ctx->curr_func_item,pMVar42,pMVar30);
                    before = local_e10;
                    create_new_bb_insns(gen_ctx,(pMVar30->insn_link).prev,(pMVar30->insn_link).next,
                                        (MIR_insn_t)local_e10);
                    ppVVar2[2] = (VARR_size_t *)local_d08;
                    ppVVar2[3] = (VARR_size_t *)CONCAT26(uStack_cfa,uStack_d00);
                    ppVVar2[4] = (VARR_size_t *)CONCAT26(uStack_cf2,uStack_cf8);
                    ppVVar2[5] = (VARR_size_t *)pHStack_cf0;
                    *ppVVar2 = (VARR_size_t *)pMStack_d18;
                    ppVVar2[1] = (VARR_size_t *)pMStack_d10;
                    ppVVar2[2] = (VARR_size_t *)local_d08;
                    ppVVar2[3] = (VARR_size_t *)CONCAT26(uStack_cfa,uStack_d00);
                    local_e60 = local_e60 + 8 + (local_e50 & 0xff) * 8;
                    uVar52 = local_da0;
                    uVar58 = local_d98;
                    if (pMVar33 != (MIR_insn_t)0x0) {
                      gen_add_insn_after(gen_ctx,pMVar42,pMVar33);
                      uVar52 = local_da0;
                      uVar58 = local_d98;
                    }
                  }
                  else {
                    if (pMVar33 != (MIR_insn_t)0x0) {
                      gen_add_insn_before(gen_ctx,(MIR_insn_t)local_e10,pMVar33);
                    }
                    MVar45 = local_d7c;
                    uVar52 = local_da0;
                    if (MVar46 == MIR_T_RBLK) {
                      if ((char)pMStack_dd0 != '\v') {
                        __assert_fail("arg_op.mode == MIR_OP_VAR_MEM",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                      ,0x198,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                      }
                      _MIR_new_var_op(unaff_R14,MVar27);
                      _MIR_new_var_op(unaff_R14,local_db8);
                      in_stack_fffffffffffff108 = pMStack_1d8;
                      in_stack_fffffffffffff118 = pMStack_1c8;
                      uVar64 = uStack_1e4;
                      pMVar30 = MIR_new_insn(unaff_R14,MVar45);
                      in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)CONCAT44(uVar64,1);
                      _MIR_new_var_mem_op((MIR_op_t *)local_cb8,unaff_R14,MIR_T_RBLK,
                                          (MIR_disp_t)local_db0,MVar27,0xffffffff,'\x01');
                      uStack_cc8 = (undefined1)aStack_ca8._16_8_;
                      uStack_cc7 = (undefined7)((ulong)aStack_ca8._16_8_ >> 8);
                      pHStack_cc0 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
                      local_ce8 = (MIR_item_t_conflict)local_cb8._0_8_;
                      uStack_ce0 = (MIR_module_t_conflict)local_cb8._8_8_;
                      bStack_cd8 = (byte)aStack_ca8.i;
                      uStack_cd7 = (undefined7)((ulong)aStack_ca8._0_8_ >> 8);
                      uStack_cd0 = SUB81(aStack_ca8.str.s,0);
                      uStack_ccf = (undefined7)((ulong)aStack_ca8._8_8_ >> 8);
                    }
                    else {
                      _MIR_new_var_op(unaff_R14,MVar27);
                      uStack_cc8 = (undefined1)aStack_ca8._16_8_;
                      uStack_cc7 = (undefined7)((ulong)aStack_ca8._16_8_ >> 8);
                      pHStack_cc0 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
                      local_ce8 = (MIR_item_t_conflict)local_cb8._0_8_;
                      uStack_ce0 = (MIR_module_t_conflict)local_cb8._8_8_;
                      bStack_cd8 = (byte)aStack_ca8.i;
                      uStack_cd7 = (undefined7)((ulong)aStack_ca8._0_8_ >> 8);
                      uStack_cd0 = SUB81(aStack_ca8.str.s,0);
                      uStack_ccf = (undefined7)((ulong)aStack_ca8._8_8_ >> 8);
                      in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
                      in_stack_fffffffffffff108 = aStack_ca8.i;
                      in_stack_fffffffffffff118 = aStack_ca8._16_8_;
                      pMVar30 = MIR_new_insn(unaff_R14,local_d7c);
                    }
                    before = local_e10;
                    gen_add_insn_before(gen_ctx,(MIR_insn_t)local_e10,pMVar30);
                    ppVVar2[2] = (VARR_size_t *)CONCAT71(uStack_cd7,bStack_cd8);
                    ppVVar2[3] = (VARR_size_t *)CONCAT71(uStack_ccf,uStack_cd0);
                    ppVVar2[4] = (VARR_size_t *)CONCAT71(uStack_cc7,uStack_cc8);
                    ppVVar2[5] = (VARR_size_t *)pHStack_cc0;
                    *ppVVar2 = (VARR_size_t *)local_ce8;
                    ppVVar2[1] = (VARR_size_t *)uStack_ce0;
                    ppVVar2[2] = (VARR_size_t *)CONCAT71(uStack_cd7,bStack_cd8);
                    ppVVar2[3] = (VARR_size_t *)CONCAT71(uStack_ccf,uStack_cd0);
                  }
                }
              }
LAB_0015a5ad:
              uVar58 = uVar58 + local_e61;
              uVar47 = local_b50 + 1;
            } while (uVar47 != local_d28);
          }
          else {
            uVar58 = 0;
            local_e60 = 0;
          }
          if (local_e20[0x18] != '\0') {
            setup_call_hard_reg_args(gen_ctx,(MIR_insn_t)before,0);
            _MIR_new_var_op(unaff_R14,0);
            MIR_new_int_op(unaff_R14,uVar58);
            in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)CONCAT44(uStack_a84,local_a88);
            in_stack_fffffffffffff108 = pMStack_a78;
            in_stack_fffffffffffff118 = pMStack_a68;
            pMVar30 = MIR_new_insn(unaff_R14,MIR_MOV);
            gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          }
          if (*(int *)(local_e20 + 8) != 0) {
            puVar59 = &(before->environment_module).last_temp_item_num;
            uVar47 = 0;
            uVar29 = 0;
            uVar41 = 0;
            uVar54 = 0;
            do {
              local_cb8._0_8_ = *(undefined8 *)puVar59;
              local_cb8._8_8_ = *(undefined8 *)(puVar59 + 2);
              aStack_ca8.i = *(undefined8 *)(puVar59 + 4);
              aStack_ca8.str.s = (char *)*(undefined8 *)(puVar59 + 6);
              aStack_ca8._16_8_ = *(undefined8 *)(puVar59 + 8);
              aStack_ca8.mem.disp = *(undefined8 *)(puVar59 + 10);
              if (local_cb8[8] != '\x02') goto LAB_0015ac33;
              iVar56 = *(int *)(*(long *)(local_e20 + 0x10) + uVar47 * 4);
              if (uVar29 < 2 && iVar56 == 8) {
                _MIR_new_var_op(unaff_R14,0x11 - (uVar29 == 0));
                MVar45 = MIR_FMOV;
LAB_0015a796:
                in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
                in_stack_fffffffffffff108 = aStack_ca8.i;
                in_stack_fffffffffffff118 = aStack_ca8._16_8_;
                pMVar30 = MIR_new_insn(unaff_R14,MVar45);
                uVar29 = uVar29 + 1;
              }
              else {
                if (iVar56 == 9 && uVar29 < 2) {
                  _MIR_new_var_op(unaff_R14,0x11 - (uVar29 == 0));
                  MVar45 = MIR_DMOV;
                  goto LAB_0015a796;
                }
                if (uVar54 < 2 && iVar56 == 10) {
                  _MIR_new_var_op(unaff_R14,0x21 - (uVar54 == 0));
                  in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
                  in_stack_fffffffffffff108 = aStack_ca8.i;
                  in_stack_fffffffffffff118 = aStack_ca8._16_8_;
                  pMVar30 = MIR_new_insn(unaff_R14,MIR_LDMOV);
                  uVar54 = uVar54 + 1;
                }
                else {
                  if (1 < uVar41) goto LAB_0015acbd;
                  _MIR_new_var_op(unaff_R14,(uint)(uVar41 != 0) * 2);
                  in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
                  in_stack_fffffffffffff108 = aStack_ca8.i;
                  in_stack_fffffffffffff118 = aStack_ca8._16_8_;
                  pMVar30 = MIR_new_insn(unaff_R14,MIR_MOV);
                  uVar41 = uVar41 + 1;
                }
              }
              MIR_insert_insn_after
                        (unaff_R14,gen_ctx->curr_func_item,(MIR_insn_t_conflict)local_e10,pMVar30);
              pvVar14 = pMVar30[1].data;
              pMVar33 = pMVar30[1].insn_link.prev;
              pMVar17 = pMVar30[1].insn_link.next;
              uVar62 = *(undefined8 *)&pMVar30[1].field_0x18;
              uVar63 = *(undefined8 *)&pMVar30[1].field_0x18;
              pvVar18 = pMVar30[1].ops[0].data;
              uVar19 = *(undefined8 *)&pMVar30[1].ops[0].field_0x8;
              *(MIR_insn_t *)(puVar59 + 4) = pMVar30[1].insn_link.next;
              *(undefined8 *)(puVar59 + 6) = uVar63;
              *(void **)(puVar59 + 8) = pvVar18;
              *(undefined8 *)(puVar59 + 10) = uVar19;
              *(void **)puVar59 = pvVar14;
              *(MIR_insn_t *)(puVar59 + 2) = pMVar33;
              *(MIR_insn_t *)(puVar59 + 4) = pMVar17;
              *(undefined8 *)(puVar59 + 6) = uVar62;
              uVar58 = (ulong)*(uint *)(*(long *)(local_e20 + 0x10) + uVar47 * 4);
              if (uVar58 < 6) {
                pMVar34 = gen_ctx->curr_func_item;
                in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
                in_stack_fffffffffffff108 = aStack_ca8.i;
                in_stack_fffffffffffff118 = aStack_ca8._16_8_;
                pMVar36 = MIR_new_insn(unaff_R14,*(MIR_insn_code_t *)(&DAT_001b1a60 + uVar58 * 4));
                MIR_insert_insn_after(unaff_R14,pMVar34,pMVar30,pMVar36);
                pMVar30 = (pMVar30->insn_link).next;
              }
              before = local_e10;
              create_new_bb_insns(gen_ctx,(MIR_insn_t)local_e10,(pMVar30->insn_link).next,
                                  (MIR_insn_t)local_e10);
              uVar47 = uVar47 + 1;
              puVar59 = puVar59 + 0xc;
            } while (uVar47 < *(uint *)(local_e20 + 8));
          }
          if (local_e60 == 0) {
            ptVar38 = gen_ctx->target_ctx;
          }
          else {
            _MIR_new_var_op(unaff_R14,4);
            _MIR_new_var_op(unaff_R14,4);
            uVar47 = local_e60 + 0xfU & 0xfffffffffffffff0;
            MIR_new_int_op(unaff_R14,uVar47);
            pMVar37 = (MIR_context_t)MIR_new_insn(unaff_R14,MIR_SUB);
            MIR_insert_insn_after
                      (unaff_R14,gen_ctx->curr_func_item,pMVar42,(MIR_insn_t_conflict)pMVar37);
            create_new_bb_insns(gen_ctx,pMVar42,(MIR_insn_t)pMVar37->error_func,(MIR_insn_t)before);
            _MIR_new_var_op(unaff_R14,4);
            _MIR_new_var_op(unaff_R14,4);
            MIR_new_int_op(unaff_R14,uVar47);
            in_stack_fffffffffffff0f8 = local_368;
            in_stack_fffffffffffff108 = pMStack_358;
            in_stack_fffffffffffff118 = pMStack_348;
            pMVar30 = MIR_new_insn(unaff_R14,MIR_ADD);
            MIR_insert_insn_after
                      (unaff_R14,gen_ctx->curr_func_item,(MIR_insn_t_conflict)before,pMVar30);
            create_new_bb_insns(gen_ctx,(MIR_insn_t)before,(pMVar30->insn_link).next,
                                (MIR_insn_t)before);
            ptVar38 = gen_ctx->target_ctx;
            unaff_R14 = pMVar37;
            if ((local_e60 + 0xfU & 0xfffffffffffffff0) != 0) {
              ptVar38->keep_fp_p = '\x01';
            }
          }
          ptVar38->leaf_p = '\0';
          pMVar37 = local_e28;
        }
        goto switchD_001578ac_caseD_58;
      case MIR_DIV:
      case MIR_DIVS:
      case MIR_UDIV:
      case MIR_UDIVS:
      case MIR_UMULO:
      case MIR_UMULOS:
        _MIR_new_var_op(ctx,0);
        pMVar30 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
        in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)before->insn_nops;
        in_stack_fffffffffffff108 = before->temp_string;
        in_stack_fffffffffffff118 = before->used_label_p;
        pMVar30 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_after(gen_ctx,(MIR_insn_t)before,pMVar30);
        (before->environment_module).items.head = (MIR_item_t_conflict)aStack_ca8.i;
        (before->environment_module).items.tail = (MIR_item_t_conflict)aStack_ca8.str.s;
        (before->environment_module).module_link.prev = (MIR_module_t)aStack_ca8._16_8_;
        (before->environment_module).module_link.next = (MIR_module_t)aStack_ca8.mem.disp;
        (before->environment_module).data = (void *)local_cb8._0_8_;
        (before->environment_module).name = (char *)local_cb8._8_8_;
        (before->environment_module).items.head = (MIR_item_t_conflict)aStack_ca8.i;
        (before->environment_module).items.tail = (MIR_item_t_conflict)aStack_ca8.str.s;
        before->used_label_p = (VARR_uint8_t *)aStack_ca8._16_8_;
        before->module_item_tab = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
        pMVar34 = (MIR_item_t_conflict)local_cb8._0_8_;
        pMVar61 = (MIR_module_t_conflict)local_cb8._8_8_;
        uVar62 = aStack_ca8.i;
        uVar63 = aStack_ca8.str.s;
        goto LAB_00158326;
      case MIR_MOD:
      case MIR_MODS:
      case MIR_UMOD:
      case MIR_UMODS:
        _MIR_new_var_op(ctx,0);
        _MIR_new_var_op(ctx,2);
        pMVar30 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
        (before->environment_module).items.head = (MIR_item_t_conflict)aStack_ca8.i;
        (before->environment_module).items.tail = (MIR_item_t_conflict)aStack_ca8.str.s;
        (before->environment_module).module_link.prev = (MIR_module_t)aStack_ca8._16_8_;
        (before->environment_module).module_link.next = (MIR_module_t)aStack_ca8.mem.disp;
        (before->environment_module).data = (void *)local_cb8._0_8_;
        (before->environment_module).name = (char *)local_cb8._8_8_;
        (before->environment_module).items.head = (MIR_item_t_conflict)aStack_ca8.i;
        (before->environment_module).items.tail = (MIR_item_t_conflict)aStack_ca8.str.s;
        in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)before->insn_nops;
        in_stack_fffffffffffff108 = before->temp_string;
        in_stack_fffffffffffff118 = before->used_label_p;
        pMVar30 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_after(gen_ctx,(MIR_insn_t)before,pMVar30);
        uVar62 = CONCAT71(uStack_dc7,bStack_dc8);
        before->temp_string = (VARR_char *)CONCAT71(uStack_dc7,bStack_dc8);
        before->temp_data = (VARR_uint8_t *)pMStack_dc0;
        before->used_label_p = (VARR_uint8_t *)CONCAT44(uStack_db4,local_db8);
        before->module_item_tab = local_db0;
        pMVar34 = local_dd8;
        pMVar61 = pMStack_dd0;
        uVar63 = pMStack_dc0;
LAB_00158326:
        before->insn_nops = (VARR_size_t *)pMVar34;
        before->unspec_protos = (VARR_MIR_proto_t *)pMVar61;
        before->temp_string = (VARR_char *)uVar62;
        before->temp_data = (VARR_uint8_t *)uVar63;
        unaff_R14 = ctx;
        goto switchD_001578ac_caseD_58;
      case MIR_LSH:
      case MIR_LSHS:
      case MIR_RSH:
      case MIR_RSHS:
      case MIR_URSH:
      case MIR_URSHS:
        _MIR_new_var_op(ctx,1);
        in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
        in_stack_fffffffffffff108 = aStack_ca8.i;
        in_stack_fffffffffffff118 = aStack_ca8._16_8_;
        pMVar30 = MIR_new_insn(ctx,MIR_MOV);
        gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
        before->curr_func = (MIR_func_t)aStack_ca8.i;
        before->curr_label_num = (size_t)aStack_ca8.str.s;
        (before->all_modules).head = (MIR_module_t_conflict)aStack_ca8._16_8_;
        (before->all_modules).tail = (MIR_module_t_conflict)aStack_ca8.mem.disp;
        *(undefined8 *)&(before->environment_module).last_temp_item_num = local_cb8._0_8_;
        before->curr_module = (MIR_module_t_conflict)local_cb8._8_8_;
        before->curr_func = (MIR_func_t)aStack_ca8.i;
        before->curr_label_num = (size_t)aStack_ca8.str.s;
        unaff_R14 = ctx;
        goto switchD_001578ac_caseD_58;
      case MIR_EQ:
      case MIR_EQS:
      case MIR_FEQ:
      case MIR_DEQ:
      case MIR_NE:
      case MIR_NES:
      case MIR_FNE:
      case MIR_DNE:
      case MIR_LT:
      case MIR_LTS:
      case MIR_ULT:
      case MIR_ULTS:
      case MIR_FLT:
      case MIR_DLT:
      case MIR_LE:
      case MIR_LES:
      case MIR_ULE:
      case MIR_ULES:
      case MIR_FLE:
      case MIR_DLE:
      case MIR_GT:
      case MIR_GTS:
      case MIR_UGT:
      case MIR_UGTS:
      case MIR_FGT:
      case MIR_DGT:
      case MIR_GE:
      case MIR_GES:
      case MIR_UGE:
      case MIR_UGES:
      case MIR_FGE:
      case MIR_DGE:
        in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)before->insn_nops;
        in_stack_fffffffffffff108 = before->temp_string;
        in_stack_fffffffffffff118 = before->used_label_p;
        pMVar30 = MIR_new_insn(ctx,MIR_UEXT8);
        gen_add_insn_after(gen_ctx,(MIR_insn_t)before,pMVar30);
        switch(MVar45) {
        case MIR_FLT:
          pvStack_e08 = (before->environment_module).data;
          pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
          local_df8 = (MIR_func_t)(before->environment_module).items.head;
          pMStack_df0 = (before->environment_module).items.tail;
          pMStack_de8 = (before->environment_module).module_link.prev;
          pMStack_de0 = (before->environment_module).module_link.next;
          pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
          pMVar61 = before->curr_module;
          pMVar32 = before->curr_func;
          pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
          pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
          pMVar13 = (before->all_modules).head;
          pMVar15 = (before->all_modules).tail;
          (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
          (before->environment_module).items.tail = pMVar35;
          (before->environment_module).module_link.prev = pMVar13;
          (before->environment_module).module_link.next = pMVar15;
          (before->environment_module).data = pvVar14;
          (before->environment_module).name = (char *)pMVar61;
          (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
          (before->environment_module).items.tail = pMVar34;
          *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
          before->curr_module = pMStack_e00;
          before->curr_func = local_df8;
          before->curr_label_num = (size_t)pMStack_df0;
          before->curr_func = local_df8;
          before->curr_label_num = (size_t)pMStack_df0;
          (before->all_modules).head = pMStack_de8;
          (before->all_modules).tail = pMStack_de0;
          uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 100;
          break;
        case MIR_DLT:
          pvStack_e08 = (before->environment_module).data;
          pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
          local_df8 = (MIR_func_t)(before->environment_module).items.head;
          pMStack_df0 = (before->environment_module).items.tail;
          pMStack_de8 = (before->environment_module).module_link.prev;
          pMStack_de0 = (before->environment_module).module_link.next;
          pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
          pMVar61 = before->curr_module;
          pMVar32 = before->curr_func;
          pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
          pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
          pMVar13 = (before->all_modules).head;
          pMVar15 = (before->all_modules).tail;
          (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
          (before->environment_module).items.tail = pMVar35;
          (before->environment_module).module_link.prev = pMVar13;
          (before->environment_module).module_link.next = pMVar15;
          (before->environment_module).data = pvVar14;
          (before->environment_module).name = (char *)pMVar61;
          (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
          (before->environment_module).items.tail = pMVar34;
          *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
          before->curr_module = pMStack_e00;
          before->curr_func = local_df8;
          before->curr_label_num = (size_t)pMStack_df0;
          before->curr_func = local_df8;
          before->curr_label_num = (size_t)pMStack_df0;
          (before->all_modules).head = pMStack_de8;
          (before->all_modules).tail = pMStack_de0;
          uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x65;
          break;
        default:
          goto switchD_001578ac_caseD_58;
        case MIR_FLE:
          pvStack_e08 = (before->environment_module).data;
          pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
          local_df8 = (MIR_func_t)(before->environment_module).items.head;
          pMStack_df0 = (before->environment_module).items.tail;
          pMStack_de8 = (before->environment_module).module_link.prev;
          pMStack_de0 = (before->environment_module).module_link.next;
          pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
          pMVar61 = before->curr_module;
          pMVar32 = before->curr_func;
          pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
          pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
          pMVar13 = (before->all_modules).head;
          pMVar15 = (before->all_modules).tail;
          (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
          (before->environment_module).items.tail = pMVar35;
          (before->environment_module).module_link.prev = pMVar13;
          (before->environment_module).module_link.next = pMVar15;
          (before->environment_module).data = pvVar14;
          (before->environment_module).name = (char *)pMVar61;
          (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
          (before->environment_module).items.tail = pMVar34;
          *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
          before->curr_module = pMStack_e00;
          before->curr_func = local_df8;
          before->curr_label_num = (size_t)pMStack_df0;
          before->curr_func = local_df8;
          before->curr_label_num = (size_t)pMStack_df0;
          (before->all_modules).head = pMStack_de8;
          (before->all_modules).tail = pMStack_de0;
          uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x6b;
          break;
        case MIR_DLE:
          pvStack_e08 = (before->environment_module).data;
          pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
          local_df8 = (MIR_func_t)(before->environment_module).items.head;
          pMStack_df0 = (before->environment_module).items.tail;
          pMStack_de8 = (before->environment_module).module_link.prev;
          pMStack_de0 = (before->environment_module).module_link.next;
          pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
          pMVar61 = before->curr_module;
          pMVar32 = before->curr_func;
          pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
          pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
          pMVar13 = (before->all_modules).head;
          pMVar15 = (before->all_modules).tail;
          (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
          (before->environment_module).items.tail = pMVar35;
          (before->environment_module).module_link.prev = pMVar13;
          (before->environment_module).module_link.next = pMVar15;
          (before->environment_module).data = pvVar14;
          (before->environment_module).name = (char *)pMVar61;
          (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
          (before->environment_module).items.tail = pMVar34;
          *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
          before->curr_module = pMStack_e00;
          before->curr_func = local_df8;
          before->curr_label_num = (size_t)pMStack_df0;
          before->curr_func = local_df8;
          before->curr_label_num = (size_t)pMStack_df0;
          (before->all_modules).head = pMStack_de8;
          (before->all_modules).tail = pMStack_de0;
          uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x6c;
        }
        break;
      case MIR_LDLT:
        pvStack_e08 = (before->environment_module).data;
        pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
        local_df8 = (MIR_func_t)(before->environment_module).items.head;
        pMStack_df0 = (before->environment_module).items.tail;
        pMStack_de8 = (before->environment_module).module_link.prev;
        pMStack_de0 = (before->environment_module).module_link.next;
        pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
        pMVar61 = before->curr_module;
        pMVar32 = before->curr_func;
        pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar13 = (before->all_modules).head;
        pMVar15 = (before->all_modules).tail;
        (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
        (before->environment_module).items.tail = pMVar35;
        (before->environment_module).module_link.prev = pMVar13;
        (before->environment_module).module_link.next = pMVar15;
        (before->environment_module).data = pvVar14;
        (before->environment_module).name = (char *)pMVar61;
        (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
        (before->environment_module).items.tail = pMVar34;
        *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
        before->curr_module = pMStack_e00;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        (before->all_modules).head = pMStack_de8;
        (before->all_modules).tail = pMStack_de0;
        uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x66;
        break;
      case MIR_LDLE:
        pvStack_e08 = (before->environment_module).data;
        pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
        local_df8 = (MIR_func_t)(before->environment_module).items.head;
        pMStack_df0 = (before->environment_module).items.tail;
        pMStack_de8 = (before->environment_module).module_link.prev;
        pMStack_de0 = (before->environment_module).module_link.next;
        pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
        pMVar61 = before->curr_module;
        pMVar32 = before->curr_func;
        pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar13 = (before->all_modules).head;
        pMVar15 = (before->all_modules).tail;
        (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
        (before->environment_module).items.tail = pMVar35;
        (before->environment_module).module_link.prev = pMVar13;
        (before->environment_module).module_link.next = pMVar15;
        (before->environment_module).data = pvVar14;
        (before->environment_module).name = (char *)pMVar61;
        (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
        (before->environment_module).items.tail = pMVar34;
        *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
        before->curr_module = pMStack_e00;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        (before->all_modules).head = pMStack_de8;
        (before->all_modules).tail = pMStack_de0;
        uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x6d;
        break;
      case MIR_FBLT:
        pvStack_e08 = (before->environment_module).data;
        pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
        local_df8 = (MIR_func_t)(before->environment_module).items.head;
        pMStack_df0 = (before->environment_module).items.tail;
        pMStack_de8 = (before->environment_module).module_link.prev;
        pMStack_de0 = (before->environment_module).module_link.next;
        pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
        pMVar61 = before->curr_module;
        pMVar32 = before->curr_func;
        pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar13 = (before->all_modules).head;
        pMVar15 = (before->all_modules).tail;
        (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
        (before->environment_module).items.tail = pMVar35;
        (before->environment_module).module_link.prev = pMVar13;
        (before->environment_module).module_link.next = pMVar15;
        (before->environment_module).data = pvVar14;
        (before->environment_module).name = (char *)pMVar61;
        (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
        (before->environment_module).items.tail = pMVar34;
        *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
        before->curr_module = pMStack_e00;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        (before->all_modules).head = pMStack_de8;
        (before->all_modules).tail = pMStack_de0;
        uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x97;
        break;
      case MIR_DBLT:
        pvStack_e08 = (before->environment_module).data;
        pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
        local_df8 = (MIR_func_t)(before->environment_module).items.head;
        pMStack_df0 = (before->environment_module).items.tail;
        pMStack_de8 = (before->environment_module).module_link.prev;
        pMStack_de0 = (before->environment_module).module_link.next;
        pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
        pMVar61 = before->curr_module;
        pMVar32 = before->curr_func;
        pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar13 = (before->all_modules).head;
        pMVar15 = (before->all_modules).tail;
        (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
        (before->environment_module).items.tail = pMVar35;
        (before->environment_module).module_link.prev = pMVar13;
        (before->environment_module).module_link.next = pMVar15;
        (before->environment_module).data = pvVar14;
        (before->environment_module).name = (char *)pMVar61;
        (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
        (before->environment_module).items.tail = pMVar34;
        *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
        before->curr_module = pMStack_e00;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        (before->all_modules).head = pMStack_de8;
        (before->all_modules).tail = pMStack_de0;
        uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x98;
        break;
      case MIR_LDBLT:
        pvStack_e08 = (before->environment_module).data;
        pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
        local_df8 = (MIR_func_t)(before->environment_module).items.head;
        pMStack_df0 = (before->environment_module).items.tail;
        pMStack_de8 = (before->environment_module).module_link.prev;
        pMStack_de0 = (before->environment_module).module_link.next;
        pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
        pMVar61 = before->curr_module;
        pMVar32 = before->curr_func;
        pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar13 = (before->all_modules).head;
        pMVar15 = (before->all_modules).tail;
        (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
        (before->environment_module).items.tail = pMVar35;
        (before->environment_module).module_link.prev = pMVar13;
        (before->environment_module).module_link.next = pMVar15;
        (before->environment_module).data = pvVar14;
        (before->environment_module).name = (char *)pMVar61;
        (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
        (before->environment_module).items.tail = pMVar34;
        *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
        before->curr_module = pMStack_e00;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        (before->all_modules).head = pMStack_de8;
        (before->all_modules).tail = pMStack_de0;
        uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x99;
        break;
      case MIR_FBLE:
        pvStack_e08 = (before->environment_module).data;
        pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
        local_df8 = (MIR_func_t)(before->environment_module).items.head;
        pMStack_df0 = (before->environment_module).items.tail;
        pMStack_de8 = (before->environment_module).module_link.prev;
        pMStack_de0 = (before->environment_module).module_link.next;
        pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
        pMVar61 = before->curr_module;
        pMVar32 = before->curr_func;
        pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar13 = (before->all_modules).head;
        pMVar15 = (before->all_modules).tail;
        (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
        (before->environment_module).items.tail = pMVar35;
        (before->environment_module).module_link.prev = pMVar13;
        (before->environment_module).module_link.next = pMVar15;
        (before->environment_module).data = pvVar14;
        (before->environment_module).name = (char *)pMVar61;
        (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
        (before->environment_module).items.tail = pMVar34;
        *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
        before->curr_module = pMStack_e00;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        (before->all_modules).head = pMStack_de8;
        (before->all_modules).tail = pMStack_de0;
        uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x9e;
        break;
      case MIR_DBLE:
        pvStack_e08 = (before->environment_module).data;
        pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
        local_df8 = (MIR_func_t)(before->environment_module).items.head;
        pMStack_df0 = (before->environment_module).items.tail;
        pMStack_de8 = (before->environment_module).module_link.prev;
        pMStack_de0 = (before->environment_module).module_link.next;
        pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
        pMVar61 = before->curr_module;
        pMVar32 = before->curr_func;
        pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar13 = (before->all_modules).head;
        pMVar15 = (before->all_modules).tail;
        (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
        (before->environment_module).items.tail = pMVar35;
        (before->environment_module).module_link.prev = pMVar13;
        (before->environment_module).module_link.next = pMVar15;
        (before->environment_module).data = pvVar14;
        (before->environment_module).name = (char *)pMVar61;
        (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
        (before->environment_module).items.tail = pMVar34;
        *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
        before->curr_module = pMStack_e00;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        (before->all_modules).head = pMStack_de8;
        (before->all_modules).tail = pMStack_de0;
        uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0x9f;
        break;
      case MIR_LDBLE:
        pvStack_e08 = (before->environment_module).data;
        pMStack_e00 = (MIR_module_t_conflict)(before->environment_module).name;
        local_df8 = (MIR_func_t)(before->environment_module).items.head;
        pMStack_df0 = (before->environment_module).items.tail;
        pMStack_de8 = (before->environment_module).module_link.prev;
        pMStack_de0 = (before->environment_module).module_link.next;
        pvVar14 = *(void **)&(before->environment_module).last_temp_item_num;
        pMVar61 = before->curr_module;
        pMVar32 = before->curr_func;
        pMVar34 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar35 = (MIR_item_t_conflict)before->curr_label_num;
        pMVar13 = (before->all_modules).head;
        pMVar15 = (before->all_modules).tail;
        (before->environment_module).items.head = (MIR_item_t_conflict)before->curr_func;
        (before->environment_module).items.tail = pMVar35;
        (before->environment_module).module_link.prev = pMVar13;
        (before->environment_module).module_link.next = pMVar15;
        (before->environment_module).data = pvVar14;
        (before->environment_module).name = (char *)pMVar61;
        (before->environment_module).items.head = (MIR_item_t_conflict)pMVar32;
        (before->environment_module).items.tail = pMVar34;
        *(void **)&(before->environment_module).last_temp_item_num = pvStack_e08;
        before->curr_module = pMStack_e00;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        before->curr_func = local_df8;
        before->curr_label_num = (size_t)pMStack_df0;
        (before->all_modules).head = pMStack_de8;
        (before->all_modules).tail = pMStack_de0;
        uVar47 = *(ulong *)&before->func_redef_permission_p & 0xffffffff00000000 | 0xa0;
        break;
      default:
        switch(MVar45) {
        case MIR_RET:
          uVar29 = ((gen_ctx->curr_func_item->u).func)->nres;
          local_e28 = pMVar37;
          sVar31 = MIR_insn_nops(ctx,(MIR_insn_t_conflict)before);
          if (sVar31 != uVar29) {
            __assert_fail("curr_func_item->u.func->nres == MIR_insn_nops (ctx, insn)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x3c2,"void target_machinize(gen_ctx_t)");
          }
          pMVar32 = (gen_ctx->curr_func_item->u).func;
          pMVar37 = local_e28;
          if (pMVar32->nres != 0) {
            uVar47 = 0;
            uVar41 = 0;
            uVar29 = 0;
            uVar54 = 0;
            pMVar55 = (MIR_module *)&before->insn_nops;
            do {
              MVar46 = pMVar32->res_types[uVar47];
              if (uVar41 < 2 && (MVar46 & ~MIR_T_U8) == MIR_T_F) {
                local_e2c = (MVar46 != MIR_T_F) + MIR_FMOV;
                MVar27 = 0x11 - (uVar41 == 0);
                uVar41 = uVar41 + 1;
              }
              else if (uVar29 < 2 && MVar46 == MIR_T_LD) {
                local_e2c = MIR_LDMOV;
                MVar27 = 0x21 - (uVar29 == 0);
                uVar29 = uVar29 + 1;
              }
              else {
                unaff_R14 = ctx;
                if (1 < uVar54) goto LAB_0015acbd;
                bVar60 = uVar54 != 0;
                uVar54 = uVar54 + 1;
                local_e2c = MIR_MOV;
                MVar27 = (uint)bVar60 * 2;
              }
              MVar45 = local_e2c;
              _MIR_new_var_op(ctx,MVar27);
              pMStack_a38 = (MIR_module_t)aStack_ca8._16_8_;
              pHStack_a30 = (HTAB_MIR_item_t *)aStack_ca8.mem.disp;
              pMStack_a58 = (MIR_item_t_conflict)local_cb8._0_8_;
              pMStack_a50 = (MIR_module_t_conflict)local_cb8._8_8_;
              local_a48 = (MIR_func_t)aStack_ca8.i;
              pMStack_a40 = (MIR_item_t_conflict)aStack_ca8.str.s;
              in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_cb8._0_8_;
              in_stack_fffffffffffff108 = aStack_ca8.i;
              in_stack_fffffffffffff118 = aStack_ca8._16_8_;
              pMVar30 = MIR_new_insn(ctx,MVar45);
              gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
              uVar47 = uVar47 + 1;
              (pMVar55->items).head = (MIR_item_t_conflict)local_a48;
              (pMVar55->items).tail = pMStack_a40;
              (pMVar55->module_link).prev = pMStack_a38;
              (pMVar55->module_link).next = (MIR_module_t)pHStack_a30;
              pMVar55->data = pMStack_a58;
              pMVar55->name = (char *)pMStack_a50;
              (pMVar55->items).head = (MIR_item_t_conflict)local_a48;
              (pMVar55->items).tail = pMStack_a40;
              unaff_R14 = (MIR_context_t)&pMVar55->last_temp_item_num;
              pMVar32 = (gen_ctx->curr_func_item->u).func;
              pMVar37 = local_e28;
              pMVar55 = (MIR_module *)unaff_R14;
            } while (uVar47 < pMVar32->nres);
          }
          break;
        default:
          goto switchD_00157848_caseD_10;
        case MIR_ALLOCA:
          ptVar38 = gen_ctx->target_ctx;
          ptVar38->alloca_p = '\x01';
          ptVar38->keep_fp_p = '\x01';
          break;
        case MIR_VA_ARG:
        case MIR_VA_BLOCK_ARG:
          pMVar34 = (MIR_item_t_conflict)before->insn_nops;
          uVar7 = *(undefined2 *)&before->unspec_protos;
          uStack_cf8 = (undefined6)((ulong)before->module_item_tab >> 0x10);
          pMStack_d18 = *(MIR_item_t_conflict *)((long)&before->unspec_protos + 2);
          pMStack_d10 = *(MIR_module_t_conflict *)((long)&before->temp_string + 2);
          local_d08 = *(MIR_func_t *)((long)&before->temp_data + 2);
          uVar62 = *(undefined8 *)((long)&before->used_label_p + 2);
          uStack_d00 = (undefined6)uVar62;
          uStack_cfa = (undefined2)((ulong)uVar62 >> 0x30);
          pMVar35 = (MIR_item_t_conflict)(before->environment_module).data;
          uVar5 = *(undefined2 *)&(before->environment_module).name;
          uStack_a98 = (undefined6)((ulong)(before->environment_module).module_link.next >> 0x10);
          local_ab8 = *(MIR_item_t_conflict *)((long)&(before->environment_module).name + 2);
          uStack_ab0 = *(undefined8 *)((long)&(before->environment_module).items.head + 2);
          pMStack_aa8 = *(MIR_func_t *)((long)&(before->environment_module).items.tail + 2);
          uVar62 = *(undefined8 *)((long)&(before->environment_module).module_link.prev + 2);
          uStack_aa0 = (undefined6)uVar62;
          uStack_a9a = (undefined2)((ulong)uVar62 >> 0x30);
          local_e70 = *(MIR_context_t *)&(before->environment_module).last_temp_item_num;
          uVar6 = *(undefined2 *)&before->curr_module;
          uStack_ae4 = *(undefined2 *)((long)&before->curr_module + 6);
          local_ae8 = *(undefined4 *)((long)&before->curr_module + 2);
          local_b48.data = *(void **)((long)&before->curr_func + 1);
          bVar53 = *(byte *)&before->curr_func;
          local_b48._8_7_ = SUB87(*(undefined8 *)((long)&before->curr_label_num + 1),0);
          pMVar61 = (before->all_modules).head;
          pMVar13 = (before->all_modules).tail;
          local_b48._15_1_ = SUB81(pMVar61,0);
          local_b48.u.i._0_7_ = (undefined7)((ulong)pMVar61 >> 8);
          local_b48.u.i._7_1_ = SUB81(pMVar13,0);
          local_b48.u._8_7_ = (undefined7)((ulong)pMVar13 >> 8);
          get_builtin(gen_ctx,MVar45,local_9f8,(MIR_item_t_conflict *)&local_a28);
          if ((((char)uVar7 != '\x02') || (local_e78 = (char)uVar5, local_e78 != '\x02')) ||
             ((char)((MVar45 == MIR_VA_ARG) * '\t' + '\x02') != (char)uVar6)) {
            __assert_fail("res_reg_op.mode == MIR_OP_VAR && va_reg_op.mode == MIR_OP_VAR && op3.mode == (code == MIR_VA_ARG ? MIR_OP_VAR_MEM : MIR_OP_VAR)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x3a0,"void target_machinize(gen_ctx_t)");
          }
          MVar27 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_e18);
          uVar29 = MVar27 + 0x21;
          if ((uVar29 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar29)) {
            gen_ctx->curr_cfg->max_var = uVar29;
          }
          local_e20 = (char *)CONCAT62(local_e20._2_6_,uVar6);
          _MIR_new_var_op(ctx,uVar29);
          pMStack_dc0 = (MIR_item_t_conflict)CONCAT26(uStack_d4a,uStack_d50);
          local_db8 = (MIR_reg_t)uStack_d48;
          uStack_db4 = (undefined4)(CONCAT26(uStack_d42,uStack_d48) >> 0x20);
          local_db0 = pHStack_d40;
          local_dd8 = local_d68;
          pMStack_dd0 = pMStack_d60;
          bStack_dc8 = (byte)pMStack_d58;
          uStack_dc7 = (undefined7)((ulong)pMStack_d58 >> 8);
          MVar27 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_e18);
          uVar29 = MVar27 + 0x21;
          if ((uVar29 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar29)) {
            gen_ctx->curr_cfg->max_var = uVar29;
          }
          _MIR_new_var_op(ctx,uVar29);
          uStack_cc8 = (undefined1)uStack_d48;
          uStack_cc7 = (undefined7)(CONCAT26(uStack_d42,uStack_d48) >> 8);
          pHStack_cc0 = pHStack_d40;
          local_ce8 = local_d68;
          uStack_ce0 = pMStack_d60;
          bStack_cd8 = (byte)pMStack_d58;
          uStack_cd7 = (undefined7)((ulong)pMStack_d58 >> 8);
          uStack_cd0 = (undefined1)uStack_d50;
          uStack_ccf = (undefined7)(CONCAT26(uStack_d4a,uStack_d50) >> 8);
          MIR_new_ref_op(ctx,(MIR_item_t_conflict)local_a28.data);
          in_stack_fffffffffffff108 = CONCAT71(uStack_dc7,bStack_dc8);
          in_stack_fffffffffffff118 = CONCAT44(uStack_db4,local_db8);
          in_stack_fffffffffffff0f8 = local_dd8;
          local_e28 = (MIR_context_t)MIR_new_insn(ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,(MIR_insn_t)before,(MIR_insn_t)local_e28);
          if (MVar45 == MIR_VA_ARG) {
            MIR_new_int_op(ctx,(ulong)bVar53);
            in_stack_fffffffffffff108 = CONCAT71(uStack_cd7,bStack_cd8);
            in_stack_fffffffffffff118 = CONCAT71(uStack_cc7,uStack_cc8);
            in_stack_fffffffffffff0f8 = local_ce8;
            pMVar30 = MIR_new_insn(ctx,MIR_MOV);
            bVar53 = bStack_cd8;
            uVar8 = (ushort)uStack_ce0;
            local_b48.data = (void *)CONCAT17(uStack_cd0,uStack_cd7);
            local_e70 = (MIR_context_t)local_ce8;
            local_ae8 = uStack_ce0._2_4_;
            uStack_ae4 = uStack_ce0._6_2_;
            local_b48._8_7_ = uStack_ccf;
            local_b48._15_1_ = uStack_cc8;
            local_b48.u.i._0_7_ = uStack_cc7;
            local_b48.u.i._7_1_ = SUB81(pHStack_cc0,0);
            local_b48.u._8_7_ = (undefined7)((ulong)pHStack_cc0 >> 8);
            gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          }
          else {
            uVar8 = (ushort)local_e20;
          }
          unaff_R14 = (MIR_context_t)(ulong)uVar8;
          MIR_new_ref_op(ctx,local_9f8[0]);
          pMVar32 = pMStack_aa8;
          uVar19 = uStack_ab0;
          pMVar25 = local_ab8;
          uVar6 = uStack_ae4;
          uVar24 = local_b48._15_1_;
          uVar23 = local_b48._8_7_;
          pvVar14 = local_b48.data;
          puVar22 = local_b90;
          aStack_ca8._16_8_ = CONCAT26(uStack_d42,uStack_d48);
          aStack_ca8.str.s = (char *)CONCAT26(uStack_d4a,uStack_d50);
          aStack_ca8.mem.disp = (MIR_disp_t)pHStack_d40;
          local_cb8._0_8_ = local_d68;
          local_cb8._8_8_ = pMStack_d60;
          aStack_ca8.i = (int64_t)pMStack_d58;
          pMStack_c78._1_7_ = uStack_dc7;
          pMStack_c78._0_1_ = bStack_dc8;
          uVar62 = pMStack_c78;
          auStack_c68._4_4_ = uStack_db4;
          auStack_c68._0_4_ = local_db8;
          uVar63 = pMStack_c78;
          pMStack_c70 = pMStack_dc0;
          _pMStack_c78 = CONCAT88(pMStack_c70,uVar62);
          auStack_c68._8_8_ = local_db0;
          local_c88 = local_dd8;
          pMStack_c80 = pMStack_dd0;
          _pMStack_c78 = CONCAT88(pMStack_c70,uVar63);
          uStack_c2e = uStack_cf8;
          uStack_c4e = SUB86(pMStack_d18,0);
          local_c48 = (undefined2)((ulong)pMStack_d18 >> 0x30);
          uStack_c46 = SUB86(pMStack_d10,0);
          uStack_c40 = (undefined2)((ulong)pMStack_d10 >> 0x30);
          uStack_c3e = SUB86(local_d08,0);
          uStack_c38 = (undefined2)((ulong)local_d08 >> 0x30);
          uStack_c36 = uStack_d00;
          uStack_c30 = uStack_cfa;
          uVar62 = CONCAT26(uStack_a9a,uStack_aa0);
          local_c20._0_2_ = uVar5;
          *(ulong *)((long)local_b90 + 0x1e) = CONCAT62(uStack_a98,uStack_a9a);
          *puVar22 = pMVar25;
          puVar22[1] = uVar19;
          puVar22[2] = pMVar32;
          puVar22[3] = uVar62;
          pHStack_bd0 = (HTAB_MIR_item_t *)CONCAT71(local_b48.u._8_7_,local_b48.u.i._7_1_);
          local_bf0 = (MIR_module_t_conflict)CONCAT26(uVar6,CONCAT42(local_ae8,uVar8));
          uStack_bd7 = local_b48.u.i._0_7_;
          uStack_be7 = SUB87(pvVar14,0);
          uStack_be0 = (undefined1)((ulong)pvVar14 >> 0x38);
          uStack_bdf = uVar23;
          uStack_bd8 = uVar24;
          if (MVar45 == MIR_VA_BLOCK_ARG) {
            pVStack_bc8 = before->modules_to_link;
            pVStack_bc0 = before->temp_ops;
            local_bb8 = before->string_ctx;
            prStack_bb0 = before->reg_ctx;
            paStack_ba8 = before->alias_ctx;
            psStack_ba0 = before->simplify_ctx;
          }
          local_c58 = pMVar34;
          local_c50 = uVar7;
          local_c28 = pMVar35;
          local_bf8 = (MIR_item_t_conflict)local_e70;
          local_be8 = bVar53;
          pMVar30 = MIR_new_insn_arr(ctx,MIR_CALL,(ulong)(MVar45 != MIR_VA_ARG) + 5,
                                     (MIR_op_t *)local_cb8);
          gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          gen_delete_insn(gen_ctx,(MIR_insn_t)before);
          pMVar37 = local_e28;
          break;
        case MIR_VA_START:
          MVar27 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func);
          uVar29 = MVar27 + 0x21;
          if ((uVar29 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar29)) {
            gen_ctx->curr_cfg->max_var = uVar29;
          }
          _MIR_new_var_op(ctx,uVar29);
          if ((local_e18->vararg_p == '\0') || (*(char *)&before->unspec_protos != '\x02')) {
            __assert_fail("func->vararg_p && va_op.mode == MIR_OP_VAR",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x361,"void target_machinize(gen_ctx_t)");
          }
          MVar27 = *(MIR_reg_t *)&before->temp_string;
          uVar29 = local_e18->nargs;
          if ((ulong)uVar29 == 0) {
            iVar56 = 8;
            i = 0x30;
            i_00 = 0;
          }
          else {
            pVVar9 = local_e18->vars;
            if (((pVVar9 == (VARR_MIR_var_t *)0x0) ||
                (pMVar10 = pVVar9->varr, pMVar10 == (MIR_var_t *)0x0)) ||
               (pVVar9->els_num <= (ulong)(uVar29 - 1))) {
              target_machinize_cold_2();
LAB_0015acbd:
              p_Var39 = MIR_get_error_func(unaff_R14);
              pcVar48 = "x86-64 can not handle this combination of return values";
              MVar50 = MIR_ret_error;
LAB_0015acd1:
              (*p_Var39)(MVar50,pcVar48);
              goto LAB_0015acd8;
            }
            lVar57 = 0;
            iVar56 = 0;
            iVar49 = 0;
            iVar40 = 0x30;
            do {
              uVar54 = *(uint *)((long)&pMVar10->type + lVar57);
              if ((uVar54 & 0xfffffffe) == 8) {
                iVar40 = iVar40 + 0x10;
                bVar60 = SBORROW4(iVar49,0xb0);
                iVar12 = iVar49 + -0xb0;
LAB_001589bc:
                iVar26 = iVar56 + 8;
                if (bVar60 != iVar12 < 0) {
                  iVar26 = iVar56;
                }
              }
              else if (uVar54 == 10) {
                iVar26 = iVar56 + 0x10;
              }
              else {
                if (uVar54 - 0x11 < 0xfffffffb) {
                  bVar60 = SBORROW4(iVar49,0x28);
                  iVar12 = iVar49 + -0x28;
                  iVar49 = iVar49 + 8;
                  goto LAB_001589bc;
                }
                iVar26 = iVar56 + (int)*(undefined8 *)((long)&pMVar10->size + lVar57);
              }
              iVar56 = iVar26;
              lVar57 = lVar57 + 0x18;
            } while ((ulong)uVar29 * 0x18 != lVar57);
            i_00 = (int64_t)iVar49;
            i = (int64_t)iVar40;
            iVar56 = iVar56 + 8;
          }
          _MIR_new_var_mem_op(local_758,ctx,MIR_T_U32,0,MVar27,0xffffffff,'\x01');
          MIR_new_int_op(ctx,i_00);
          pMVar30 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          local_e28 = (MIR_context_t)before->c2mir_ctx;
          _MIR_new_var_mem_op(local_7b8,ctx,MIR_T_U32,4,MVar27,0xffffffff,'\x01');
          MIR_new_int_op(ctx,i);
          pMVar30 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          _MIR_new_var_op(ctx,5);
          MIR_new_int_op(ctx,(long)iVar56 + (long)gen_ctx->target_ctx->start_sp_from_bp_offset);
          pMVar30 = MIR_new_insn(ctx,MIR_ADD);
          gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          _MIR_new_var_mem_op(local_878,ctx,MIR_T_I64,8,MVar27,0xffffffff,'\x01');
          pMVar30 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          _MIR_new_var_op(ctx,5);
          MIR_new_int_op(ctx,-0xb0);
          pMVar30 = MIR_new_insn(ctx,MIR_ADD);
          gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          _MIR_new_var_mem_op(local_908,ctx,MIR_T_I64,0x10,MVar27,0xffffffff,'\x01');
          in_stack_fffffffffffff0f8 = (MIR_item_t_conflict)local_908[0].data;
          in_stack_fffffffffffff108 = local_908[0].u.i;
          in_stack_fffffffffffff118 = local_908[0].u._16_8_;
          pMVar30 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,(MIR_insn_t)before,pMVar30);
          gen_delete_insn(gen_ctx,(MIR_insn_t)before);
          pMVar37 = local_e28;
          unaff_R14 = ctx;
          break;
        case MIR_VA_END:
          goto LAB_00158219;
        }
        goto switchD_001578ac_caseD_58;
      }
      *(ulong *)&before->func_redef_permission_p = uVar47;
switchD_001578ac_caseD_58:
      before = pMVar37;
    } while (before != (MIR_context_t)0x0);
  }
  return;
}

Assistant:

static void target_machinize (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_func_t func;
  MIR_type_t type, mem_type, res_type;
  MIR_insn_code_t code, new_insn_code;
  MIR_insn_t insn, next_insn, new_insn;
  MIR_reg_t ret_reg, arg_reg;
  MIR_op_t ret_reg_op, arg_reg_op, mem_op, temp_op;
  size_t i, blk_size, int_arg_num = 0, fp_arg_num = 0, mem_size = spill_space_size;

  assert (curr_func_item->item_type == MIR_func_item);
  func = curr_func_item->u.func;
  block_arg_func_p = FALSE;
  start_sp_from_bp_offset = 8;
  keep_fp_p = func->vararg_p;
  for (i = 0; i < func->nargs; i++) {
    /* Argument extensions is already done in simplify */
    /* Prologue: generate arg_var = hard_reg|stack mem|stack addr ... */
    type = VARR_GET (MIR_var_t, func->vars, i).type;
    blk_size = MIR_blk_type_p (type) ? (VARR_GET (MIR_var_t, func->vars, i).size + 7) / 8 * 8 : 0;
#ifndef _WIN32
    if ((type == MIR_T_BLK + 1 && get_int_arg_reg (int_arg_num) != MIR_NON_VAR
         && (blk_size <= 8 || get_int_arg_reg (int_arg_num + 1) != MIR_NON_VAR))
        || (type == MIR_T_BLK + 2 && get_fp_arg_reg (fp_arg_num) != MIR_NON_VAR
            && (blk_size <= 8 || get_fp_arg_reg (fp_arg_num + 1) != MIR_NON_VAR))) {
      /* all is passed in gprs or fprs */
      MIR_type_t mov_type = type == MIR_T_BLK + 1 ? MIR_T_I64 : MIR_T_D;
      MIR_insn_code_t mov_code1, mov_code2;
      MIR_reg_t reg2, reg1 = get_arg_reg (mov_type, &int_arg_num, &fp_arg_num, &mov_code1);

      assert (blk_size <= 16);
      if (blk_size > 8) {
        reg2 = get_arg_reg (mov_type, &int_arg_num, &fp_arg_num, &mov_code2);
        new_insn = MIR_new_insn (ctx, mov_code1,
                                 _MIR_new_var_mem_op (ctx, mov_type, 8, i + MAX_HARD_REG + 1,
                                                      MIR_NON_VAR, 1),
                                 _MIR_new_var_op (ctx, reg2));
        prepend_insn (gen_ctx, new_insn);
      }
      new_insn = MIR_new_insn (ctx, mov_code1,
                               _MIR_new_var_mem_op (ctx, mov_type, 0, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg1));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_ALLOCA, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               MIR_new_int_op (ctx, blk_size));
      prepend_insn (gen_ctx, new_insn);
      continue;
    } else if ((type == MIR_T_BLK + 3 || type == MIR_T_BLK + 4)
               && get_int_arg_reg (int_arg_num) != MIR_NON_VAR
               && get_fp_arg_reg (fp_arg_num) != MIR_NON_VAR) {
      /* gpr and then fpr or fpr and then gpr */
      MIR_type_t mov_type1 = type == MIR_T_BLK + 3 ? MIR_T_I64 : MIR_T_D;
      MIR_type_t mov_type2 = type == MIR_T_BLK + 3 ? MIR_T_D : MIR_T_I64;
      MIR_insn_code_t mov_code1, mov_code2;
      MIR_reg_t reg1 = get_arg_reg (mov_type1, &int_arg_num, &fp_arg_num, &mov_code1);
      MIR_reg_t reg2 = get_arg_reg (mov_type2, &int_arg_num, &fp_arg_num, &mov_code2);

      assert (blk_size > 8 && blk_size <= 16);
      new_insn = MIR_new_insn (ctx, mov_code2,
                               _MIR_new_var_mem_op (ctx, mov_type2, 8, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg2));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, mov_code1,
                               _MIR_new_var_mem_op (ctx, mov_type1, 0, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg1));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_ALLOCA, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               MIR_new_int_op (ctx, blk_size));
      prepend_insn (gen_ctx, new_insn);
      continue;
    }
#endif
    int blk_p = MIR_blk_type_p (type);
#ifdef _WIN32
    if (blk_p && blk_size > 8) { /* just address */
      blk_p = FALSE;
      type = MIR_T_I64;
    }
#endif
    if (blk_p) {
      keep_fp_p = block_arg_func_p = TRUE;
#ifdef _WIN32
      assert (blk_size <= 8);
      if ((arg_reg = get_arg_reg (MIR_T_I64, &int_arg_num, &fp_arg_num, &new_insn_code))
          == MIR_NON_VAR) {
        new_insn
          = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)),
                          _MIR_new_var_op (ctx, FP_HARD_REG),
                          MIR_new_int_op (ctx, mem_size + 8 /* ret */
                                                 + start_sp_from_bp_offset));
        mem_size += 8;
      } else { /* put reg into spill space and use its address: prepend in reverse order:  */
        int disp = (int) (mem_size + 8 /* ret */ + start_sp_from_bp_offset - spill_space_size
                          + 8 * get_int_arg_reg_num (arg_reg));
        new_insn
          = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)),
                          _MIR_new_var_op (ctx, FP_HARD_REG), MIR_new_int_op (ctx, disp));
        prepend_insn (gen_ctx, new_insn);
        arg_reg_op = _MIR_new_var_op (ctx, arg_reg);
        mem_op = _MIR_new_var_mem_op (ctx, MIR_T_I64, disp, FP_HARD_REG, MIR_NON_VAR, 1);
        new_insn = MIR_new_insn (ctx, MIR_MOV, mem_op, arg_reg_op);
      }
#else
      new_insn = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, mem_size + 8 /* ret addr */
                                                      + start_sp_from_bp_offset));
      mem_size += blk_size;
#endif
      prepend_insn (gen_ctx, new_insn);
    } else if ((arg_reg = get_arg_reg (type, &int_arg_num, &fp_arg_num, &new_insn_code))
               != MIR_NON_VAR) {
      arg_reg_op = _MIR_new_var_op (ctx, arg_reg);
      new_insn
        = MIR_new_insn (ctx, new_insn_code,
                        _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)), arg_reg_op);
      prepend_insn (gen_ctx, new_insn);
    } else {
      /* arg is on the stack */
      keep_fp_p = block_arg_func_p = TRUE;
      mem_type = type == MIR_T_F || type == MIR_T_D || type == MIR_T_LD ? type : MIR_T_I64;
      new_insn_code = (type == MIR_T_F    ? MIR_FMOV
                       : type == MIR_T_D  ? MIR_DMOV
                       : type == MIR_T_LD ? MIR_LDMOV
                                          : MIR_MOV);
      mem_op = _MIR_new_var_mem_op (ctx, mem_type,
                                    mem_size + 8 /* ret */
                                      + start_sp_from_bp_offset,
                                    FP_HARD_REG, MIR_NON_VAR, 1);
      new_insn = MIR_new_insn (ctx, new_insn_code,
                               _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)), mem_op);
      prepend_insn (gen_ctx, new_insn);
      mem_size += type == MIR_T_LD ? 16 : 8;
    }
  }
  alloca_p = FALSE;
  leaf_p = TRUE;
  for (insn = DLIST_HEAD (MIR_insn_t, func->insns); insn != NULL; insn = next_insn) {
    next_insn = DLIST_NEXT (MIR_insn_t, insn);
    code = insn->code;
    switch (code) {
    case MIR_UI2F:
    case MIR_UI2D:
    case MIR_UI2LD:
    case MIR_LD2I: {
      /* Use a builtin func call: mov freg, func ref; call proto, freg, res_reg, op_reg */
      MIR_item_t proto_item, func_import_item;
      MIR_op_t freg_op, res_reg_op = insn->ops[0], op_reg_op = insn->ops[1], ops[4];

      get_builtin (gen_ctx, code, &proto_item, &func_import_item);
      assert (res_reg_op.mode == MIR_OP_VAR && op_reg_op.mode == MIR_OP_VAR);
      freg_op
        = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, curr_func_item->u.func));
      next_insn = new_insn
        = MIR_new_insn (ctx, MIR_MOV, freg_op, MIR_new_ref_op (ctx, func_import_item));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      ops[0] = MIR_new_ref_op (ctx, proto_item);
      ops[1] = freg_op;
      ops[2] = res_reg_op;
      ops[3] = op_reg_op;
      new_insn = MIR_new_insn_arr (ctx, MIR_CALL, 4, ops);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_VA_START: {
      MIR_op_t treg_op
        = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, curr_func_item->u.func));
      MIR_op_t va_op = insn->ops[0];
      MIR_reg_t va_reg;
#ifndef _WIN32
      int gp_offset = 0, fp_offset = 48, mem_offset = 0;
      MIR_var_t var;

      assert (func->vararg_p && va_op.mode == MIR_OP_VAR);
      for (uint32_t narg = 0; narg < func->nargs; narg++) {
        var = VARR_GET (MIR_var_t, func->vars, narg);
        if (var.type == MIR_T_F || var.type == MIR_T_D) {
          fp_offset += 16;
          if (gp_offset >= 176) mem_offset += 8;
        } else if (var.type == MIR_T_LD) {
          mem_offset += 16;
        } else if (MIR_blk_type_p (var.type)) {
          mem_offset += var.size;
        } else { /* including RBLK */
          gp_offset += 8;
          if (gp_offset >= 48) mem_offset += 8;
        }
      }
      va_reg = va_op.u.var;
      /* Insns can be not simplified as soon as they match a machine insn.  */
      /* mem32[va_reg] = gp_offset; mem32[va_reg] = fp_offset */
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_U32, 0, va_reg, MIR_NON_VAR, 1),
               MIR_new_int_op (ctx, gp_offset));
      next_insn = DLIST_PREV (MIR_insn_t, insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_U32, 4, va_reg, MIR_NON_VAR, 1),
               MIR_new_int_op (ctx, fp_offset));
      /* overflow_arg_area_reg: treg = start sp + 8 + mem_offset; mem64[va_reg + 8] = treg */
      new_insn
        = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                        MIR_new_int_op (ctx, 8 /*ret*/ + mem_offset + start_sp_from_bp_offset));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 8, va_reg, MIR_NON_VAR, 1), treg_op);
      /* reg_save_area: treg = start sp - reg_save_area_size; mem64[va_reg + 16] = treg */
      new_insn = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, -reg_save_area_size));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 16, va_reg, MIR_NON_VAR, 1), treg_op);
#else
      /* init va_list */
      mem_size = 8 /*ret*/ + start_sp_from_bp_offset + func->nargs * 8;
      new_insn = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, mem_size));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      va_reg = va_op.u.var;
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 0, va_reg, MIR_NON_VAR, 1), treg_op);
#endif
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_VA_END: /* do nothing */ gen_delete_insn (gen_ctx, insn); break;
    case MIR_VA_ARG:
    case MIR_VA_BLOCK_ARG: {
      /* Use a builtin func call:
         mov func_reg, func ref; [mov reg3, type;] call proto, func_reg, res_reg, va_reg,
         reg3 */
      MIR_item_t proto_item, func_import_item;
      MIR_op_t ops[6], func_reg_op, reg_op3;
      MIR_op_t res_reg_op = insn->ops[0], va_reg_op = insn->ops[1], op3 = insn->ops[2];

      get_builtin (gen_ctx, code, &proto_item, &func_import_item);
      assert (res_reg_op.mode == MIR_OP_VAR && va_reg_op.mode == MIR_OP_VAR
              && op3.mode == (code == MIR_VA_ARG ? MIR_OP_VAR_MEM : MIR_OP_VAR));
      func_reg_op = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, func));
      reg_op3 = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, func));
      next_insn = new_insn
        = MIR_new_insn (ctx, MIR_MOV, func_reg_op, MIR_new_ref_op (ctx, func_import_item));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      if (code == MIR_VA_ARG) {
        new_insn = MIR_new_insn (ctx, MIR_MOV, reg_op3,
                                 MIR_new_int_op (ctx, (int64_t) op3.u.var_mem.type));
        op3 = reg_op3;
        gen_add_insn_before (gen_ctx, insn, new_insn);
      }
      ops[0] = MIR_new_ref_op (ctx, proto_item);
      ops[1] = func_reg_op;
      ops[2] = res_reg_op;
      ops[3] = va_reg_op;
      ops[4] = op3;
      if (code == MIR_VA_BLOCK_ARG) ops[5] = insn->ops[3];
      new_insn = MIR_new_insn_arr (ctx, MIR_CALL, code == MIR_VA_ARG ? 5 : 6, ops);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_ALLOCA: keep_fp_p = alloca_p = TRUE; break;
    case MIR_RET: {
      /* In simplify we already transformed code for one return insn
         and added extension in return (if any).  */
      uint32_t n_iregs = 0, n_xregs = 0, n_fregs = 0;

#ifdef _WIN32
      if (curr_func_item->u.func->nres > 1)
        (*MIR_get_error_func (ctx)) (MIR_ret_error,
                                     "Windows x86-64 doesn't support multiple return values");
#endif
      assert (curr_func_item->u.func->nres == MIR_insn_nops (ctx, insn));
      for (size_t nres = 0; nres < curr_func_item->u.func->nres; nres++) {
        res_type = curr_func_item->u.func->res_types[nres];
        if ((res_type == MIR_T_F || res_type == MIR_T_D) && n_xregs < 2) {
          new_insn_code = res_type == MIR_T_F ? MIR_FMOV : MIR_DMOV;
          ret_reg = n_xregs++ == 0 ? XMM0_HARD_REG : XMM1_HARD_REG;
        } else if (res_type == MIR_T_LD && n_fregs < 2) {  // ???
          new_insn_code = MIR_LDMOV;
          ret_reg = n_fregs == 0 ? ST0_HARD_REG : ST1_HARD_REG;
          n_fregs++;
        } else if (n_iregs < 2) {
          new_insn_code = MIR_MOV;
          ret_reg = n_iregs++ == 0 ? AX_HARD_REG : DX_HARD_REG;
        } else {
          (*MIR_get_error_func (ctx)) (MIR_ret_error,
                                       "x86-64 can not handle this combination of return values");
        }
        ret_reg_op = _MIR_new_var_op (ctx, ret_reg);
        new_insn = MIR_new_insn (ctx, new_insn_code, ret_reg_op, insn->ops[nres]);
        gen_add_insn_before (gen_ctx, insn, new_insn);
        insn->ops[nres] = ret_reg_op;
      }
      break;
    }
    case MIR_LSH:
    case MIR_RSH:
    case MIR_URSH:
    case MIR_LSHS:
    case MIR_RSHS:
    case MIR_URSHS: {
      /* We can access only cl as shift register: */
      MIR_op_t creg_op = _MIR_new_var_op (ctx, CX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, creg_op, insn->ops[2]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      insn->ops[2] = creg_op;
      break;
    }
    case MIR_UMULO:
    case MIR_UMULOS: {
      /* We can use only ax as zero and the 1st operand: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], areg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = insn->ops[1] = areg_op;
      break;
    }
    case MIR_DIV:
    case MIR_UDIV:
    case MIR_DIVS:
    case MIR_UDIVS: {
      /* Divide uses ax/dx as operands: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], areg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = insn->ops[1] = areg_op;
      break;
    }
    case MIR_MOD:
    case MIR_UMOD:
    case MIR_MODS:
    case MIR_UMODS: {
      /* Divide uses ax/dx as operands: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);
      MIR_op_t dreg_op = _MIR_new_var_op (ctx, DX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      insn->ops[1] = areg_op;
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], dreg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = dreg_op;
      break;
    }
    case MIR_EQ:
    case MIR_NE:
    case MIR_LT:
    case MIR_ULT:
    case MIR_LE:
    case MIR_ULE:
    case MIR_GT:
    case MIR_UGT:
    case MIR_GE:
    case MIR_UGE:
    case MIR_EQS:
    case MIR_NES:
    case MIR_LTS:
    case MIR_ULTS:
    case MIR_LES:
    case MIR_ULES:
    case MIR_GTS:
    case MIR_UGTS:
    case MIR_GES:
    case MIR_UGES:
    case MIR_FEQ:
    case MIR_FNE:
    case MIR_FLT:
    case MIR_FLE:
    case MIR_FGT:
    case MIR_FGE:
    case MIR_DEQ:
    case MIR_DNE:
    case MIR_DLT:
    case MIR_DLE:
    case MIR_DGT:
    case MIR_DGE: {
      new_insn = MIR_new_insn (ctx, MIR_UEXT8, insn->ops[0], insn->ops[0]);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      /* Following conditional branches are changed to correctly process unordered numbers: */
      switch (code) {
      case MIR_FLT:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_FGT;
        break;
      case MIR_FLE:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_FGE;
        break;
      case MIR_DLT:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_DGT;
        break;
      case MIR_DLE:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_DGE;
        break;
      default: break; /* do nothing */
      }
      break;
    }
    /* Following conditional branches are changed to correctly process unordered numbers: */
    case MIR_LDLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDGT;
      break;
    case MIR_LDLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDGE;
      break;
    case MIR_FBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_FBGT;
      break;
    case MIR_FBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_FBGE;
      break;
    case MIR_DBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_DBGT;
      break;
    case MIR_DBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_DBGE;
      break;
    case MIR_LDBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDBGT;
      break;
    case MIR_LDBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDBGE;
      break;
    default:
      if (MIR_call_code_p (code)) {
        machinize_call (gen_ctx, insn);
        leaf_p = FALSE;
      }
      break;
    }
  }
}